

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Extrapolater.cpp
# Opt level: O3

void amrex::Extrapolater::FirstOrderExtrap
               (MultiFab *mf,Geometry *geom,int scomp,int ncomp,int ngrow)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  double *pdVar24;
  long lVar25;
  long lVar26;
  undefined8 *puVar27;
  int iVar28;
  long lVar29;
  int *piVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  uint uVar43;
  uint uVar44;
  long lVar45;
  long lVar46;
  bool bVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  Periodicity PVar51;
  int j;
  int i;
  MFIter mfi;
  iMultiFab mask;
  ulong local_658;
  Array4<double> local_5f8;
  int local_5b4;
  double *local_5b0;
  double *local_5a8;
  long local_5a0;
  long local_598;
  long local_590;
  long local_588;
  long local_580;
  long local_578;
  long local_570;
  long local_568;
  long local_560;
  long local_558;
  ulong local_550;
  ulong local_548;
  double *local_540;
  ulong local_538;
  Array4<const_int> local_530;
  double *local_4f0;
  long local_4e8;
  long local_4e0;
  long local_4d8;
  double *local_4d0;
  long local_4c8;
  long local_4c0;
  long local_4b8;
  long local_4b0;
  long local_4a8;
  long local_4a0;
  long local_498;
  int local_48c;
  long local_488;
  long local_480;
  long local_478;
  long local_470;
  long local_468;
  long local_460;
  long local_458;
  long local_450;
  uint local_444;
  int local_440;
  uint local_43c;
  long local_438;
  long local_430;
  long local_428;
  ulong local_420;
  ulong local_418;
  ulong local_410;
  double *local_408;
  double *local_400;
  double *local_3f8;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  double *local_3d8;
  long local_3d0;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  FabArray<amrex::FArrayBox> *local_3b0;
  double *local_3a8;
  double *local_3a0;
  long local_398;
  long local_390;
  long local_388;
  long local_380;
  long local_378;
  long local_370;
  double *local_368;
  double *local_360;
  double *local_358;
  double *local_350;
  double *local_348;
  double *local_340;
  double *local_338;
  double *local_330;
  double *local_328;
  double *local_320;
  double *local_318;
  double *local_310;
  double *local_308;
  double *local_300;
  double *local_2f8;
  double *local_2f0;
  double *local_2e8;
  double *local_2e0;
  long local_2d8;
  long local_2d0;
  double *local_2c8;
  double *local_2c0;
  long local_2b8;
  double *local_2b0;
  double *local_2a8;
  double *local_2a0;
  double *local_298;
  double *local_290;
  double *local_288;
  double *local_280;
  double *local_278;
  double *local_270;
  double *local_268;
  double *local_260;
  double *local_258;
  double *local_250;
  ulong local_248;
  long local_240;
  long local_238;
  Box local_22c;
  undefined1 local_210 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_200;
  int local_1e8;
  Vector<int,_std::allocator<int>_> *local_1d8;
  FabArray<amrex::IArrayBox> local_1b0;
  
  local_210._1_7_ = 0;
  local_210[0] = true;
  local_210._8_4_ = 0;
  local_210._12_4_ = 0;
  vStack_200.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_200.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_200.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_530.p = (int *)&PTR__FabFactory_00713508;
  local_444 = ngrow;
  local_43c = ncomp;
  local_3c8 = scomp;
  local_3b0 = &mf->super_FabArray<amrex::FArrayBox>;
  iMultiFab::iMultiFab
            ((iMultiFab *)&local_1b0,
             &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
             &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,ngrow,
             (MFInfo *)local_210,(FabFactory<amrex::IArrayBox> *)&local_530);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_200);
  PVar51 = Geometry::periodicity(geom);
  local_210[0] = PVar51.period.vect[0]._0_1_;
  local_210._1_7_ = PVar51.period.vect._1_7_;
  local_210._8_4_ = PVar51.period.vect[2];
  FabArray<amrex::IArrayBox>::BuildMask<amrex::IArrayBox,_0>
            (&local_1b0,&geom->domain,(Periodicity *)local_210,1,0,0,1);
  if (0 < (int)local_444) {
    local_248 = (ulong)local_43c;
    local_410 = 0xffffffff;
    local_418 = 0;
    local_440 = 1;
    local_420 = 0;
    do {
      MFIter::MFIter((MFIter *)local_210,&local_3b0->super_FabArrayBase,'\0');
      if ((int)vStack_200.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage < local_1e8) {
        do {
          BATransformer::operator()
                    (&local_22c,(BATransformer *)(CONCAT44(local_210._12_4_,local_210._8_4_) + 8),
                     (Box *)((long)(local_1d8->super_vector<int,_std::allocator<int>_>).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start
                                   [(int)vStack_200.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage] * 0x1c
                            + **(long **)(CONCAT44(local_210._12_4_,local_210._8_4_) + 0x50)));
          iVar1 = local_22c.bigend.vect[2];
          iVar18 = local_22c.bigend.vect[1];
          iVar22 = local_22c.smallend.vect[2];
          iVar8 = local_22c.smallend.vect[1];
          iVar9 = local_22c.smallend.vect[0];
          local_548 = (ulong)(uint)local_22c.bigend.vect[0];
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    (&local_530,&local_1b0,(MFIter *)local_210);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_5f8,local_3b0,(MFIter *)local_210,local_3c8);
          if (0 < (int)local_43c) {
            iVar13 = (int)local_420;
            iVar4 = iVar22 - iVar13;
            iVar11 = iVar1 + iVar13;
            local_578 = (long)iVar4 + -1;
            local_428 = (long)iVar11;
            local_590 = local_428 + 1;
            iVar28 = (int)local_578;
            local_4b8 = (iVar28 - local_530.begin.z) * local_530.kstride;
            local_4e0 = (iVar4 - local_530.begin.z) * local_530.kstride;
            iVar36 = (int)local_590;
            local_460 = (iVar36 - local_530.begin.z) * local_530.kstride;
            local_238 = (iVar11 - local_530.begin.z) * local_530.kstride;
            iVar5 = iVar8 - iVar13;
            local_580 = (long)iVar5 + -1;
            iVar21 = (int)local_580;
            iVar12 = iVar18 + iVar13;
            local_568 = (long)iVar12;
            local_598 = local_568 + 1;
            iVar37 = (int)local_598;
            lVar10 = (iVar21 - local_530.begin.y) * local_530.jstride;
            lVar31 = (iVar5 - local_530.begin.y) * local_530.jstride;
            lVar19 = (iVar37 - local_530.begin.y) * local_530.jstride;
            lVar38 = (iVar12 - local_530.begin.y) * local_530.jstride;
            local_5b4 = iVar9 - iVar13;
            local_4e8 = (long)local_5b4 + -1;
            iVar23 = (int)local_4e8;
            iVar13 = (int)local_548 + iVar13;
            local_570 = (long)iVar13;
            local_5a0 = local_570 + 1;
            iVar42 = (int)local_5a0;
            lVar45 = (long)(iVar23 - local_530.begin.x);
            lVar46 = (long)(local_5b4 - local_530.begin.x);
            local_468 = (long)local_530.p + lVar45 * 4 + lVar19 * 4;
            local_430 = (long)local_530.p + lVar46 * 4 + lVar19 * 4;
            local_470 = (long)local_530.p + lVar45 * 4 + lVar10 * 4;
            local_480 = (long)local_530.p + lVar45 * 4 + lVar31 * 4;
            local_488 = (long)local_530.p + lVar45 * 4 + lVar38 * 4;
            local_388 = (long)local_530.p + lVar46 * 4 + lVar38 * 4;
            local_438 = (long)local_530.p + lVar46 * 4 + lVar10 * 4;
            local_390 = (long)local_530.p + lVar46 * 4 + lVar31 * 4;
            local_3f0 = (long)local_530.p + (long)(iVar42 - local_530.begin.x) * 4 + lVar10 * 4;
            local_3e0 = (long)local_530.p + (long)(iVar13 - local_530.begin.x) * 4 + lVar10 * 4;
            local_3e8 = (long)local_530.p + (long)(iVar42 - local_530.begin.x) * 4 + lVar31 * 4;
            local_398 = (long)local_530.p + (long)(iVar13 - local_530.begin.x) * 4 + lVar31 * 4;
            lVar19 = (iVar5 - local_5f8.begin.y) * local_5f8.jstride;
            lVar29 = (iVar21 - local_5f8.begin.y) * local_5f8.jstride;
            lVar32 = (iVar12 - local_5f8.begin.y) * local_5f8.jstride;
            lVar31 = (iVar37 - local_5f8.begin.y) * local_5f8.jstride;
            lVar46 = (long)(local_5b4 - local_5f8.begin.x);
            lVar39 = (long)(iVar23 - local_5f8.begin.x);
            local_4f0 = local_5f8.p;
            local_3a0 = local_5f8.p + lVar19 + (iVar13 - local_5f8.begin.x);
            local_2c0 = local_5f8.p + lVar29 + (iVar13 - local_5f8.begin.x);
            local_3a8 = local_5f8.p + lVar29 + (iVar42 - local_5f8.begin.x);
            local_2c8 = local_5f8.p + lVar19 + (iVar42 - local_5f8.begin.x);
            local_2d0 = (long)(iVar4 - local_5f8.begin.z);
            lVar10 = (iVar11 - local_5f8.begin.z) * local_5f8.kstride;
            lVar40 = (iVar36 - local_5f8.begin.z) * local_5f8.kstride;
            lVar45 = local_5f8.kstride * local_2d0;
            local_2d8 = (long)(iVar28 - local_5f8.begin.z);
            lVar38 = local_5f8.kstride * local_2d8;
            local_340 = local_5f8.p + lVar19 + lVar46 + lVar45;
            local_2e0 = local_5f8.p + lVar19 + lVar46 + lVar38;
            local_348 = local_5f8.p + lVar19 + lVar46 + lVar10;
            local_2e8 = local_5f8.p + lVar19 + lVar46 + lVar40;
            local_2f0 = local_5f8.p + lVar19 + lVar39 + lVar45;
            local_258 = local_5f8.p + lVar19 + lVar39 + lVar38;
            local_2f8 = local_5f8.p + lVar19 + lVar39 + lVar10;
            iVar2 = (int)local_410;
            local_4c0 = (long)(iVar2 + iVar8);
            local_478 = (long)(iVar2 + iVar22);
            iVar6 = (int)local_418;
            local_4b0 = (long)(iVar22 + iVar6);
            uVar43 = iVar1 + local_440;
            local_538 = (ulong)uVar43;
            local_4a8 = (long)(iVar8 + iVar6);
            uVar44 = iVar18 + local_440;
            local_550 = (ulong)uVar44;
            local_4a0 = (long)(iVar6 + iVar9);
            uVar7 = (int)local_548 + local_440;
            local_548 = (ulong)uVar7;
            local_300 = local_5f8.p + lVar29 + lVar46 + lVar45;
            local_260 = local_5f8.p + lVar29 + lVar46 + lVar38;
            local_308 = local_5f8.p + lVar29 + lVar46 + lVar10;
            local_268 = local_5f8.p + lVar29 + lVar46 + lVar40;
            local_270 = local_5f8.p + lVar39 + lVar19 + lVar40;
            local_250 = local_5f8.p + lVar29 + lVar39 + lVar38;
            local_278 = local_5f8.p + lVar29 + lVar39 + lVar45;
            local_3f8 = local_5f8.p + lVar29 + lVar39 + lVar40;
            local_280 = local_5f8.p + lVar29 + lVar39 + lVar10;
            local_350 = local_5f8.p + lVar32 + lVar46 + lVar45;
            local_310 = local_5f8.p + lVar32 + lVar46 + lVar38;
            local_358 = local_5f8.p + lVar32 + lVar46 + lVar10;
            local_318 = local_5f8.p + lVar32 + lVar46 + lVar40;
            local_320 = local_5f8.p + lVar31 + lVar46 + lVar45;
            local_288 = local_5f8.p + lVar31 + lVar46 + lVar38;
            local_328 = local_5f8.p + lVar31 + lVar46 + lVar10;
            local_290 = local_5f8.p + lVar31 + lVar46 + lVar40;
            local_400 = local_5f8.p + lVar31 + lVar39 + lVar40;
            local_298 = local_5f8.p + lVar32 + lVar39 + lVar40;
            local_330 = local_5f8.p + lVar32 + lVar39 + lVar45;
            local_2a0 = local_5f8.p + lVar32 + lVar39 + lVar38;
            local_338 = local_5f8.p + lVar32 + lVar39 + lVar10;
            local_2a8 = local_5f8.p + lVar31 + lVar39 + lVar10;
            local_408 = local_5f8.p + lVar31 + lVar39 + lVar38;
            local_2b0 = local_5f8.p + lVar31 + lVar39 + lVar45;
            local_360 = local_3a0 + lVar45;
            local_368 = local_3a8 + lVar38;
            local_450 = (long)(iVar9 + iVar2);
            local_558 = local_450 + -1;
            local_458 = local_450 * 4;
            local_450 = local_450 * 8;
            local_2b8 = (long)(int)uVar7 * 4;
            local_240 = (long)(int)uVar7 * 8;
            local_3b4 = *(int *)(local_470 + local_4b8 * 4);
            local_560 = local_5f8.nstride;
            local_3b8 = *(int *)(local_470 + local_460 * 4);
            local_3bc = *(int *)(local_468 + local_4b8 * 4);
            local_3c0 = *(int *)(local_468 + local_460 * 4);
            local_3c4 = *(int *)(local_3f0 + local_4b8 * 4);
            local_370 = (long)(int)uVar43;
            local_378 = (long)(int)uVar44;
            local_380 = local_4c0 + -1;
            local_498 = 0;
            local_658 = 0;
            do {
              if (iVar21 <= iVar37) {
                lVar19 = (long)local_530.p +
                         (local_4c0 - local_530.begin.y) * local_530.jstride * 4 +
                         (local_478 - local_530.begin.z) * local_530.kstride * 4 +
                         (long)local_530.begin.x * -4 + local_458;
                lVar10 = local_4c0;
                do {
                  if (iVar23 <= iVar42) {
                    lVar31 = 0;
                    do {
                      if (*(int *)(lVar19 + lVar31 * 4) == 0) {
                        *(undefined8 *)
                         ((long)local_5f8.p +
                         lVar31 * 8 +
                         local_5f8.nstride * local_498 +
                         (local_478 - local_5f8.begin.z) * local_5f8.kstride * 8 +
                         (lVar10 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                         (long)local_5f8.begin.x * -8 + local_450) = 0;
                      }
                      lVar38 = local_558 + lVar31;
                      lVar31 = lVar31 + 1;
                    } while (lVar38 + 1 <= local_570);
                  }
                  lVar19 = lVar19 + local_530.jstride * 4;
                  bVar47 = lVar10 <= local_568;
                  lVar10 = lVar10 + 1;
                } while (bVar47);
                if (iVar21 <= iVar37) {
                  lVar19 = (long)local_530.p +
                           (local_4c0 - local_530.begin.y) * local_530.jstride * 4 +
                           (local_370 - local_530.begin.z) * local_530.kstride * 4 +
                           (long)local_530.begin.x * -4 + local_458;
                  lVar10 = local_4c0;
                  do {
                    if (iVar23 <= iVar42) {
                      lVar31 = 0;
                      do {
                        if (*(int *)(lVar19 + lVar31 * 4) == 0) {
                          *(undefined8 *)
                           ((long)local_5f8.p +
                           lVar31 * 8 +
                           local_5f8.nstride * local_498 +
                           (local_370 - local_5f8.begin.z) * local_5f8.kstride * 8 +
                           (lVar10 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                           (long)local_5f8.begin.x * -8 + local_450) = 0;
                        }
                        lVar38 = local_558 + lVar31;
                        lVar31 = lVar31 + 1;
                      } while (lVar38 + 1 <= local_570);
                    }
                    lVar19 = lVar19 + local_530.jstride * 4;
                    bVar47 = lVar10 <= local_568;
                    lVar10 = lVar10 + 1;
                  } while (bVar47);
                }
              }
              if (iVar28 <= iVar36) {
                lVar19 = (long)local_530.p +
                         (local_478 - local_530.begin.z) * local_530.kstride * 4 +
                         (local_4c0 - local_530.begin.y) * local_530.jstride * 4 +
                         (long)local_530.begin.x * -4 + local_458;
                lVar10 = local_478;
                do {
                  if (iVar23 <= iVar42) {
                    lVar31 = 0;
                    do {
                      if (*(int *)(lVar19 + lVar31 * 4) == 0) {
                        *(undefined8 *)
                         ((long)local_5f8.p +
                         lVar31 * 8 +
                         local_5f8.nstride * local_498 +
                         (local_4c0 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                         (lVar10 - local_5f8.begin.z) * local_5f8.kstride * 8 +
                         (long)local_5f8.begin.x * -8 + local_450) = 0;
                      }
                      lVar38 = local_558 + lVar31;
                      lVar31 = lVar31 + 1;
                    } while (lVar38 + 1 <= local_570);
                  }
                  lVar19 = lVar19 + local_530.kstride * 4;
                  bVar47 = lVar10 <= local_428;
                  lVar10 = lVar10 + 1;
                } while (bVar47);
                if (iVar28 <= iVar36) {
                  lVar19 = (long)local_530.p +
                           (local_478 - local_530.begin.z) * local_530.kstride * 4 +
                           (local_378 - local_530.begin.y) * local_530.jstride * 4 +
                           (long)local_530.begin.x * -4 + local_458;
                  lVar10 = local_478;
                  do {
                    if (iVar23 <= iVar42) {
                      lVar31 = 0;
                      do {
                        if (*(int *)(lVar19 + lVar31 * 4) == 0) {
                          *(undefined8 *)
                           ((long)local_5f8.p +
                           lVar31 * 8 +
                           local_5f8.nstride * local_498 +
                           (local_378 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                           (lVar10 - local_5f8.begin.z) * local_5f8.kstride * 8 +
                           (long)local_5f8.begin.x * -8 + local_450) = 0;
                        }
                        lVar38 = local_558 + lVar31;
                        lVar31 = lVar31 + 1;
                      } while (lVar38 + 1 <= local_570);
                    }
                    lVar19 = lVar19 + local_530.kstride * 4;
                    bVar47 = lVar10 <= local_428;
                    lVar10 = lVar10 + 1;
                  } while (bVar47);
                  if (iVar28 <= iVar36) {
                    piVar14 = (int *)((long)local_530.p +
                                     (local_478 - local_530.begin.z) * local_530.kstride * 4 +
                                     (local_4c0 - local_530.begin.y) * local_530.jstride * 4 +
                                     (long)local_530.begin.x * -4 + local_458);
                    lVar10 = local_478;
                    do {
                      if (iVar21 <= iVar37) {
                        puVar27 = (undefined8 *)
                                  ((long)local_5f8.p +
                                  local_5f8.nstride * local_498 +
                                  (local_4c0 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                  (lVar10 - local_5f8.begin.z) * local_5f8.kstride * 8 +
                                  (long)local_5f8.begin.x * -8 + local_450);
                        piVar30 = piVar14;
                        lVar19 = local_380;
                        do {
                          if (*piVar30 == 0) {
                            *puVar27 = 0;
                          }
                          lVar19 = lVar19 + 1;
                          piVar30 = piVar30 + local_530.jstride;
                          puVar27 = puVar27 + local_5f8.jstride;
                        } while (lVar19 <= local_568);
                      }
                      piVar14 = piVar14 + local_530.kstride;
                      bVar47 = lVar10 <= local_428;
                      lVar10 = lVar10 + 1;
                    } while (bVar47);
                    if (iVar28 <= iVar36) {
                      piVar14 = (int *)((long)local_530.p +
                                       (local_478 - local_530.begin.z) * local_530.kstride * 4 +
                                       (local_4c0 - local_530.begin.y) * local_530.jstride * 4 +
                                       (long)local_530.begin.x * -4 + local_2b8);
                      lVar10 = local_478;
                      do {
                        if (iVar21 <= iVar37) {
                          puVar27 = (undefined8 *)
                                    ((long)local_5f8.p +
                                    local_5f8.nstride * local_498 +
                                    (local_4c0 - local_5f8.begin.y) * local_5f8.jstride * 8 +
                                    (lVar10 - local_5f8.begin.z) * local_5f8.kstride * 8 +
                                    (long)local_5f8.begin.x * -8 + local_240);
                          piVar30 = piVar14;
                          lVar19 = local_380;
                          do {
                            if (*piVar30 == 0) {
                              *puVar27 = 0;
                            }
                            lVar19 = lVar19 + 1;
                            piVar30 = piVar30 + local_530.jstride;
                            puVar27 = puVar27 + local_5f8.jstride;
                          } while (lVar19 <= local_568);
                        }
                        piVar14 = piVar14 + local_530.kstride;
                        bVar47 = lVar10 <= local_428;
                        lVar10 = lVar10 + 1;
                      } while (bVar47);
                    }
                  }
                }
              }
              if (local_3b4 == 0) {
                iVar9 = *(int *)(local_438 + local_4b8 * 4);
                iVar8 = *(int *)(local_480 + local_4b8 * 4);
                if (iVar9 == 1) {
                  iVar22 = *(int *)(local_470 + local_4e0 * 4);
LAB_004d3d7c:
                  dVar48 = (double)iVar9 * local_260[local_5f8.nstride * local_658] +
                           (double)iVar8 * local_258[local_5f8.nstride * local_658];
                  pdVar24 = local_278;
LAB_004d3dc7:
                  dVar48 = ((double)iVar22 * pdVar24[local_5f8.nstride * local_658] + dVar48) /
                           (double)(iVar8 + iVar9 + iVar22);
                }
                else {
                  iVar22 = *(int *)(local_470 + local_4e0 * 4);
                  if ((iVar8 == 1) || (bVar47 = iVar22 == 1, iVar22 = 1, bVar47)) goto LAB_004d3d7c;
                  iVar9 = *(int *)(local_390 + local_4b8 * 4);
                  iVar8 = *(int *)(local_438 + local_4e0 * 4);
                  if (iVar9 == 1) {
                    iVar22 = *(int *)(local_480 + local_4e0 * 4);
LAB_004d84de:
                    dVar48 = (double)iVar9 * local_2e0[local_5f8.nstride * local_658] +
                             (double)iVar8 * local_300[local_5f8.nstride * local_658];
                    pdVar24 = local_2f0;
                    goto LAB_004d3dc7;
                  }
                  iVar22 = *(int *)(local_480 + local_4e0 * 4);
                  if ((iVar8 == 1) || (bVar47 = iVar22 == 1, iVar22 = 1, bVar47)) goto LAB_004d84de;
                  dVar48 = local_340[local_5f8.nstride * local_658];
                }
                local_250[local_5f8.nstride * local_658] = dVar48;
              }
              if (local_3b8 == 0) {
                iVar9 = *(int *)(local_438 + local_460 * 4);
                iVar8 = *(int *)(local_480 + local_460 * 4);
                if (iVar9 == 1) {
                  iVar22 = *(int *)(local_470 + local_238 * 4);
LAB_004d3e49:
                  dVar49 = (double)iVar8 * local_270[local_5f8.nstride * local_658];
                  dVar48 = (double)iVar9 * local_268[local_5f8.nstride * local_658];
                  pdVar24 = local_280;
                }
                else {
                  iVar22 = *(int *)(local_470 + local_238 * 4);
                  if ((iVar8 == 1) || (bVar47 = iVar22 == 1, iVar22 = 1, bVar47)) goto LAB_004d3e49;
                  iVar9 = *(int *)(local_390 + local_460 * 4);
                  iVar8 = *(int *)(local_438 + local_238 * 4);
                  if (iVar9 == 1) {
                    iVar22 = *(int *)(local_480 + local_238 * 4);
                  }
                  else {
                    iVar22 = *(int *)(local_480 + local_238 * 4);
                    if ((iVar8 != 1) && (bVar47 = iVar22 != 1, iVar22 = 1, bVar47)) {
                      local_3f8[local_5f8.nstride * local_658] =
                           local_348[local_5f8.nstride * local_658];
                      goto LAB_004d3eba;
                    }
                  }
                  dVar49 = (double)iVar8 * local_308[local_5f8.nstride * local_658];
                  dVar48 = (double)iVar9 * local_2e8[local_5f8.nstride * local_658];
                  pdVar24 = local_2f8;
                }
                local_3f8[local_5f8.nstride * local_658] =
                     ((double)iVar22 * pdVar24[local_5f8.nstride * local_658] + dVar48 + dVar49) /
                     (double)(iVar8 + iVar9 + iVar22);
              }
LAB_004d3eba:
              if (local_3bc == 0) {
                iVar9 = *(int *)(local_430 + local_4b8 * 4);
                iVar8 = *(int *)(local_488 + local_4b8 * 4);
                if (iVar9 == 1) {
                  iVar22 = *(int *)(local_468 + local_4e0 * 4);
LAB_004d3f26:
                  dVar49 = (double)iVar8 * local_2a0[local_5f8.nstride * local_658];
                  dVar48 = (double)iVar9 * local_288[local_5f8.nstride * local_658];
                  pdVar24 = local_2b0;
                }
                else {
                  iVar22 = *(int *)(local_468 + local_4e0 * 4);
                  if ((iVar8 == 1) || (bVar47 = iVar22 == 1, iVar22 = 1, bVar47)) goto LAB_004d3f26;
                  iVar9 = *(int *)(local_388 + local_4b8 * 4);
                  iVar8 = *(int *)(local_430 + local_4e0 * 4);
                  if (iVar9 == 1) {
                    iVar22 = *(int *)(local_488 + local_4e0 * 4);
                  }
                  else {
                    iVar22 = *(int *)(local_488 + local_4e0 * 4);
                    if ((iVar8 != 1) && (bVar47 = iVar22 != 1, iVar22 = 1, bVar47)) {
                      local_408[local_5f8.nstride * local_658] =
                           local_350[local_5f8.nstride * local_658];
                      goto LAB_004d3f97;
                    }
                  }
                  dVar49 = (double)iVar8 * local_320[local_5f8.nstride * local_658];
                  dVar48 = (double)iVar9 * local_310[local_5f8.nstride * local_658];
                  pdVar24 = local_330;
                }
                local_408[local_5f8.nstride * local_658] =
                     ((double)iVar22 * pdVar24[local_5f8.nstride * local_658] + dVar48 + dVar49) /
                     (double)(iVar8 + iVar9 + iVar22);
              }
LAB_004d3f97:
              if (local_3c0 == 0) {
                iVar9 = *(int *)(local_430 + local_460 * 4);
                iVar8 = *(int *)(local_488 + local_460 * 4);
                if (iVar9 == 1) {
                  iVar22 = *(int *)(local_468 + local_238 * 4);
LAB_004d3ff3:
                  dVar49 = (double)iVar8 * local_298[local_5f8.nstride * local_658];
                  dVar48 = (double)iVar9 * local_290[local_5f8.nstride * local_658];
                  pdVar24 = local_2a8;
                }
                else {
                  iVar22 = *(int *)(local_468 + local_238 * 4);
                  if ((iVar8 == 1) || (bVar47 = iVar22 == 1, iVar22 = 1, bVar47)) goto LAB_004d3ff3;
                  iVar9 = *(int *)(local_388 + local_460 * 4);
                  iVar8 = *(int *)(local_430 + local_238 * 4);
                  if (iVar9 == 1) {
                    iVar22 = *(int *)(local_488 + local_238 * 4);
                  }
                  else {
                    iVar22 = *(int *)(local_488 + local_238 * 4);
                    if ((iVar8 != 1) && (bVar47 = iVar22 != 1, iVar22 = 1, bVar47)) {
                      local_400[local_5f8.nstride * local_658] =
                           local_358[local_5f8.nstride * local_658];
                      goto LAB_004d4061;
                    }
                  }
                  dVar49 = (double)iVar8 * local_328[local_5f8.nstride * local_658];
                  dVar48 = (double)iVar9 * local_318[local_5f8.nstride * local_658];
                  pdVar24 = local_338;
                }
                local_400[local_5f8.nstride * local_658] =
                     ((double)iVar22 * pdVar24[local_5f8.nstride * local_658] + dVar48 + dVar49) /
                     (double)(iVar8 + iVar9 + iVar22);
              }
LAB_004d4061:
              if (local_3c4 == 0) {
                iVar9 = *(int *)(local_3e0 + local_4b8 * 4);
                iVar8 = *(int *)(local_3e8 + local_4b8 * 4);
                if (iVar9 == 1) {
                  iVar22 = *(int *)(local_3f0 + local_4e0 * 4);
                }
                else {
                  iVar22 = *(int *)(local_3f0 + local_4e0 * 4);
                  if ((iVar8 != 1) && (bVar47 = iVar22 != 1, iVar22 = 1, bVar47)) {
                    if ((*(int *)(local_398 + local_4b8 * 4) == 1) ||
                       ((*(int *)(local_3e0 + local_4e0 * 4) == 1 ||
                        (*(int *)(local_3e8 + local_4e0 * 4) == 1)))) {
                      lVar10 = local_5f8.nstride * local_658;
                      iVar9 = *(int *)(local_3e0 + local_4e0 * 4);
                      iVar8 = *(int *)(local_3e8 + local_4e0 * 4);
                      local_3a8[local_5f8.kstride * local_2d8 + lVar10] =
                           ((double)iVar8 * local_2c8[local_5f8.kstride * local_2d0 + lVar10] +
                           (double)*(int *)(local_398 + local_4b8 * 4) *
                           local_3a0[local_5f8.kstride * local_2d8 + lVar10] +
                           (double)iVar9 * local_2c0[local_5f8.kstride * local_2d0 + lVar10]) /
                           (double)(iVar8 + iVar9 + *(int *)(local_398 + local_4b8 * 4));
                    }
                    else {
                      local_368[local_5f8.nstride * local_658] =
                           local_360[local_5f8.nstride * local_658];
                    }
                    goto LAB_004d41d1;
                  }
                }
                lVar38 = (iVar21 - local_5f8.begin.y) * local_5f8.jstride;
                lVar19 = (iVar28 - local_5f8.begin.z) * local_5f8.kstride;
                lVar31 = local_5f8.nstride * local_658;
                lVar10 = (long)(iVar42 - local_5f8.begin.x);
                local_5f8.p[lVar38 + lVar10 + lVar19 + lVar31] =
                     ((double)iVar22 *
                      local_5f8.p
                      [lVar38 + lVar10 + (iVar4 - local_5f8.begin.z) * local_5f8.kstride + lVar31] +
                     (double)iVar9 *
                     local_5f8.p[lVar38 + (long)(iVar13 - local_5f8.begin.x) + lVar19 + lVar31] +
                     (double)iVar8 *
                     local_5f8.p
                     [(iVar5 - local_5f8.begin.y) * local_5f8.jstride + lVar10 + lVar19 + lVar31]) /
                     (double)(iVar8 + iVar9 + iVar22);
              }
LAB_004d41d1:
              lVar31 = (long)local_530.begin.x;
              lVar46 = iVar42 - lVar31;
              lVar45 = (long)local_530.begin.y;
              lVar19 = (iVar21 - lVar45) * local_530.jstride;
              lVar38 = (long)local_530.begin.z;
              lVar29 = (iVar36 - lVar38) * local_530.kstride;
              lVar10 = lVar46 * 4 + lVar19 * 4;
              if (*(int *)((long)local_530.p + lVar29 * 4 + lVar10) == 0) {
                lVar32 = (long)(iVar13 - local_530.begin.x) * 4 + lVar19 * 4;
                iVar9 = *(int *)((long)local_530.p + lVar29 * 4 + lVar32);
                lVar39 = (iVar5 - local_530.begin.y) * local_530.jstride;
                if (iVar9 != 1) {
                  lVar40 = lVar46 * 4 + lVar39 * 4;
                  if ((*(int *)((long)local_530.p + lVar29 * 4 + lVar40) != 1) &&
                     (lVar15 = (iVar11 - local_530.begin.z) * local_530.kstride,
                     *(int *)((long)local_530.p + lVar15 * 4 + lVar10) != 1)) {
                    iVar9 = *(int *)((long)local_530.p +
                                    lVar29 * 4 + (long)(iVar13 - local_530.begin.x) * 4 + lVar39 * 4
                                    );
                    iVar8 = *(int *)((long)local_530.p + lVar15 * 4 + lVar32);
                    iVar22 = iVar8;
                    if ((iVar9 == 1) ||
                       ((iVar22 = 1, iVar8 == 1 ||
                        (iVar22 = iVar8, *(int *)((long)local_530.p + lVar15 * 4 + lVar40) == 1))))
                    {
                      lVar39 = (iVar5 - local_5f8.begin.y) * local_5f8.jstride;
                      lVar32 = local_5f8.nstride * local_658;
                      lVar16 = (iVar21 - local_5f8.begin.y) * local_5f8.jstride;
                      lVar33 = (iVar11 - local_5f8.begin.z) * local_5f8.kstride;
                      lVar3 = (iVar36 - local_5f8.begin.z) * local_5f8.kstride;
                      iVar8 = *(int *)((long)local_530.p + lVar15 * 4 + lVar40);
                      local_5f8.p[lVar16 + (long)(iVar42 - local_5f8.begin.x) + lVar3 + lVar32] =
                           ((double)iVar8 *
                            local_5f8.p
                            [lVar39 + (long)(iVar42 - local_5f8.begin.x) + lVar33 + lVar32] +
                           (double)iVar9 *
                           local_5f8.p[lVar39 + (long)(iVar13 - local_5f8.begin.x) + lVar3 + lVar32]
                           + (double)iVar22 *
                             local_5f8.p
                             [lVar16 + (long)(iVar13 - local_5f8.begin.x) + lVar33 + lVar32]) /
                           (double)(iVar22 + iVar9 + iVar8);
                    }
                    else {
                      local_5f8.p
                      [(iVar21 - local_5f8.begin.y) * local_5f8.jstride +
                       (long)(iVar42 - local_5f8.begin.x) +
                       (iVar36 - local_5f8.begin.z) * local_5f8.kstride +
                       local_5f8.nstride * local_658] =
                           local_5f8.p
                           [(iVar5 - local_5f8.begin.y) * local_5f8.jstride +
                            (long)(iVar13 - local_5f8.begin.x) +
                            (iVar11 - local_5f8.begin.z) * local_5f8.kstride +
                            local_5f8.nstride * local_658];
                    }
                    goto LAB_004d441c;
                  }
                }
                lVar33 = (iVar21 - local_5f8.begin.y) * local_5f8.jstride;
                lVar40 = (iVar36 - local_5f8.begin.z) * local_5f8.kstride;
                lVar15 = local_5f8.nstride * local_658;
                iVar8 = *(int *)((long)local_530.p + lVar29 * 4 + lVar46 * 4 + lVar39 * 4);
                lVar32 = (long)(iVar42 - local_5f8.begin.x);
                iVar22 = *(int *)((long)local_530.p +
                                 (iVar11 - local_530.begin.z) * local_530.kstride * 4 + lVar10);
                local_5f8.p[lVar33 + lVar32 + lVar40 + lVar15] =
                     ((double)iVar22 *
                      local_5f8.p
                      [lVar33 + lVar32 + (iVar11 - local_5f8.begin.z) * local_5f8.kstride + lVar15]
                     + (double)iVar9 *
                       local_5f8.p[lVar33 + (long)(iVar13 - local_5f8.begin.x) + lVar40 + lVar15] +
                       (double)iVar8 *
                       local_5f8.p
                       [(iVar5 - local_5f8.begin.y) * local_5f8.jstride + lVar32 + lVar40 + lVar15])
                     / (double)(iVar9 + iVar22 + iVar8);
              }
LAB_004d441c:
              lVar32 = (iVar28 - local_530.begin.z) * local_530.kstride;
              local_5b0 = (double *)
                          ((long)local_530.p + (iVar37 - local_530.begin.y) * local_530.jstride * 4)
              ;
              if (*(int *)((long)local_5b0 + lVar32 * 4 + lVar46 * 4) == 0) {
                lVar40 = (long)(iVar13 - local_530.begin.x);
                iVar9 = *(int *)((long)local_5b0 + lVar32 * 4 + lVar40 * 4);
                lVar39 = (iVar12 - local_530.begin.y) * local_530.jstride;
                if (iVar9 != 1) {
                  lVar15 = lVar46 * 4 + lVar39 * 4;
                  if ((*(int *)((long)local_530.p + lVar32 * 4 + lVar15) != 1) &&
                     (lVar33 = (iVar4 - local_530.begin.z) * local_530.kstride,
                     *(int *)((long)local_5b0 + lVar33 * 4 + lVar46 * 4) != 1)) {
                    iVar9 = *(int *)((long)local_530.p + lVar32 * 4 + lVar40 * 4 + lVar39 * 4);
                    iVar8 = *(int *)((long)local_5b0 + lVar33 * 4 + lVar40 * 4);
                    iVar22 = iVar8;
                    if (((iVar9 == 1) || (iVar22 = 1, iVar8 == 1)) ||
                       (iVar22 = iVar8, *(int *)((long)local_530.p + lVar33 * 4 + lVar15) == 1)) {
                      lVar40 = (iVar12 - local_5f8.begin.y) * local_5f8.jstride;
                      lVar39 = local_5f8.nstride * local_658;
                      lVar20 = (iVar37 - local_5f8.begin.y) * local_5f8.jstride;
                      lVar3 = (iVar4 - local_5f8.begin.z) * local_5f8.kstride;
                      lVar16 = (iVar28 - local_5f8.begin.z) * local_5f8.kstride;
                      iVar8 = *(int *)((long)local_530.p + lVar33 * 4 + lVar15);
                      local_5f8.p[lVar20 + (long)(iVar42 - local_5f8.begin.x) + lVar16 + lVar39] =
                           ((double)iVar8 *
                            local_5f8.p
                            [lVar40 + (long)(iVar42 - local_5f8.begin.x) + lVar3 + lVar39] +
                           (double)iVar9 *
                           local_5f8.p
                           [lVar40 + (long)(iVar13 - local_5f8.begin.x) + lVar16 + lVar39] +
                           (double)iVar22 *
                           local_5f8.p[lVar20 + (long)(iVar13 - local_5f8.begin.x) + lVar3 + lVar39]
                           ) / (double)(iVar22 + iVar9 + iVar8);
                    }
                    else {
                      local_5f8.p
                      [(iVar37 - local_5f8.begin.y) * local_5f8.jstride +
                       (long)(iVar42 - local_5f8.begin.x) +
                       (iVar28 - local_5f8.begin.z) * local_5f8.kstride +
                       local_5f8.nstride * local_658] =
                           local_5f8.p
                           [(iVar12 - local_5f8.begin.y) * local_5f8.jstride +
                            (long)(iVar13 - local_5f8.begin.x) +
                            (iVar4 - local_5f8.begin.z) * local_5f8.kstride +
                            local_5f8.nstride * local_658];
                    }
                    goto LAB_004d4603;
                  }
                }
                lVar33 = (iVar37 - local_5f8.begin.y) * local_5f8.jstride;
                lVar40 = (iVar28 - local_5f8.begin.z) * local_5f8.kstride;
                lVar15 = local_5f8.nstride * local_658;
                iVar8 = *(int *)((long)local_530.p + lVar32 * 4 + lVar46 * 4 + lVar39 * 4);
                lVar39 = (long)(iVar42 - local_5f8.begin.x);
                iVar22 = *(int *)((long)local_5b0 +
                                 (iVar4 - local_530.begin.z) * local_530.kstride * 4 + lVar46 * 4);
                local_5f8.p[lVar33 + lVar39 + lVar40 + lVar15] =
                     ((double)iVar22 *
                      local_5f8.p
                      [lVar33 + lVar39 + (iVar4 - local_5f8.begin.z) * local_5f8.kstride + lVar15] +
                     (double)iVar9 *
                     local_5f8.p[lVar33 + (long)(iVar13 - local_5f8.begin.x) + lVar40 + lVar15] +
                     (double)iVar8 *
                     local_5f8.p
                     [(iVar12 - local_5f8.begin.y) * local_5f8.jstride + lVar39 + lVar40 + lVar15])
                     / (double)(iVar8 + iVar9 + iVar22);
              }
LAB_004d4603:
              if (*(int *)((long)local_5b0 + lVar29 * 4 + lVar46 * 4) == 0) {
                lVar40 = (long)(iVar13 - local_530.begin.x);
                iVar9 = *(int *)((long)local_5b0 + lVar29 * 4 + lVar40 * 4);
                lVar39 = (iVar12 - local_530.begin.y) * local_530.jstride;
                if (iVar9 == 1) {
LAB_004d4670:
                  lVar40 = (iVar37 - local_5f8.begin.y) * local_5f8.jstride;
                  lVar15 = (iVar36 - local_5f8.begin.z) * local_5f8.kstride;
                  lVar33 = local_5f8.nstride * local_658;
                  iVar8 = *(int *)((long)local_530.p + lVar29 * 4 + lVar46 * 4 + lVar39 * 4);
                  lVar39 = (long)(iVar42 - local_5f8.begin.x);
                  dVar48 = (double)iVar8 *
                           local_5f8.p
                           [(iVar12 - local_5f8.begin.y) * local_5f8.jstride +
                            lVar39 + lVar15 + lVar33];
                  dVar49 = (double)iVar9 *
                           local_5f8.p
                           [lVar40 + (long)(iVar13 - local_5f8.begin.x) + lVar15 + lVar33];
                  iVar22 = *(int *)((long)local_5b0 +
                                   (iVar11 - local_530.begin.z) * local_530.kstride * 4 + lVar46 * 4
                                   );
                  dVar50 = (double)iVar22 *
                           local_5f8.p
                           [lVar40 + lVar39 + (iVar11 - local_5f8.begin.z) * local_5f8.kstride +
                                              lVar33];
                  iVar22 = iVar8 + iVar9 + iVar22;
                  lVar40 = lVar40 + lVar39 + lVar15;
                }
                else {
                  lVar15 = lVar46 * 4 + lVar39 * 4;
                  if ((*(int *)((long)local_530.p + lVar29 * 4 + lVar15) == 1) ||
                     (lVar33 = (iVar11 - local_530.begin.z) * local_530.kstride,
                     *(int *)((long)local_5b0 + lVar33 * 4 + lVar46 * 4) == 1)) goto LAB_004d4670;
                  iVar9 = *(int *)((long)local_530.p + lVar29 * 4 + lVar40 * 4 + lVar39 * 4);
                  iVar8 = *(int *)((long)local_5b0 + lVar33 * 4 + lVar40 * 4);
                  iVar18 = iVar8;
                  if (((iVar9 != 1) && (iVar18 = 1, iVar8 != 1)) &&
                     (iVar18 = iVar8, *(int *)((long)local_530.p + lVar33 * 4 + lVar15) != 1)) {
                    local_5f8.p
                    [(iVar37 - local_5f8.begin.y) * local_5f8.jstride +
                     (long)(iVar42 - local_5f8.begin.x) +
                     (iVar36 - local_5f8.begin.z) * local_5f8.kstride +
                     local_5f8.nstride * local_658] =
                         local_5f8.p
                         [(iVar12 - local_5f8.begin.y) * local_5f8.jstride +
                          (long)(iVar13 - local_5f8.begin.x) +
                          (iVar11 - local_5f8.begin.z) * local_5f8.kstride +
                          local_5f8.nstride * local_658];
                    goto LAB_004d479e;
                  }
                  lVar3 = (iVar12 - local_5f8.begin.y) * local_5f8.jstride;
                  lVar39 = local_5f8.nstride * local_658;
                  lVar40 = (iVar37 - local_5f8.begin.y) * local_5f8.jstride;
                  lVar16 = (iVar11 - local_5f8.begin.z) * local_5f8.kstride;
                  dVar48 = (double)iVar18 *
                           local_5f8.p
                           [lVar40 + (long)(iVar13 - local_5f8.begin.x) + lVar16 + lVar39];
                  lVar20 = (iVar36 - local_5f8.begin.z) * local_5f8.kstride;
                  dVar49 = (double)iVar9 *
                           local_5f8.p[lVar3 + (long)(iVar13 - local_5f8.begin.x) + lVar20 + lVar39]
                  ;
                  iVar22 = *(int *)((long)local_530.p + lVar33 * 4 + lVar15);
                  dVar50 = (double)iVar22 *
                           local_5f8.p[lVar3 + (long)(iVar42 - local_5f8.begin.x) + lVar16 + lVar39]
                  ;
                  iVar22 = iVar18 + iVar9 + iVar22;
                  lVar40 = lVar40 + (iVar42 - local_5f8.begin.x) + lVar20;
                }
                (local_5f8.p + lVar40)[local_5f8.nstride * local_658] =
                     (dVar50 + dVar49 + dVar48) / (double)iVar22;
              }
LAB_004d479e:
              if (iVar4 <= iVar11) {
                lVar39 = (long)(iVar23 - local_530.begin.x) * 4 + lVar19 * 4;
                lVar40 = (long)(local_5b4 - local_530.begin.x) * 4 + lVar19 * 4;
                lVar15 = (long)(iVar23 - local_530.begin.x) * 4 +
                         (iVar5 - local_530.begin.y) * local_530.jstride * 4;
                lVar16 = (long)(local_5b4 - local_5f8.begin.x);
                lVar25 = (iVar5 - local_5f8.begin.y) * local_5f8.jstride;
                lVar3 = (long)local_5f8.begin.z;
                lVar34 = (iVar21 - local_5f8.begin.y) * local_5f8.jstride;
                lVar35 = (long)(iVar23 - local_5f8.begin.x);
                lVar20 = local_5f8.nstride * local_658;
                local_5a8 = local_5f8.p + lVar25 + lVar16 + lVar20;
                lVar33 = local_4b0;
                do {
                  lVar17 = (lVar33 - lVar38) * local_530.kstride;
                  if (*(int *)((long)local_530.p + lVar17 * 4 + lVar39) == 0) {
                    iVar9 = *(int *)((long)local_530.p + lVar17 * 4 + lVar40);
                    iVar8 = *(int *)((long)local_530.p + lVar17 * 4 + lVar15);
                    iVar22 = iVar8;
                    if ((iVar9 != 1) && (iVar22 = 1, iVar8 != 1)) {
                      lVar17 = ((lVar33 + -1) - lVar38) * local_530.kstride;
                      iVar22 = iVar8;
                      if (*(int *)((long)local_530.p + lVar17 * 4 + lVar39) != 1) {
                        lVar41 = ((lVar33 + 1) - lVar38) * local_530.kstride;
                        if (*(int *)((long)local_530.p + lVar41 * 4 + lVar39) != 1) {
                          iVar9 = *(int *)((long)local_530.p + lVar17 * 4 + lVar40);
                          lVar26 = ((lVar33 + -1) - lVar3) * local_5f8.kstride;
                          iVar8 = *(int *)((long)local_530.p + lVar41 * 4 + lVar40);
                          iVar22 = *(int *)((long)local_530.p + lVar17 * 4 + lVar15);
                          lVar17 = ((lVar33 + 1) - lVar3) * local_5f8.kstride;
                          iVar18 = *(int *)((long)local_530.p + lVar41 * 4 + lVar15);
                          lVar41 = (lVar33 - lVar3) * local_5f8.kstride;
                          local_5f8.p[lVar34 + lVar35 + lVar20 + lVar41] =
                               ((double)iVar18 * local_5f8.p[lVar25 + lVar35 + lVar20 + lVar17] +
                               (double)iVar22 * local_5f8.p[lVar25 + lVar35 + lVar20 + lVar26] +
                               (double)iVar8 * local_5f8.p[lVar34 + lVar16 + lVar20 + lVar17] +
                               (double)iVar9 * local_5f8.p[lVar34 + lVar16 + lVar20 + lVar26] +
                               local_5a8[lVar41]) / (double)(iVar9 + iVar8 + iVar22 + iVar18 + 1);
                          goto LAB_004d4993;
                        }
                      }
                    }
                    lVar17 = (lVar33 - lVar3) * local_5f8.kstride;
                    iVar8 = *(int *)((long)local_530.p +
                                    ((lVar33 + -1) - lVar38) * local_530.kstride * 4 + lVar39);
                    iVar18 = *(int *)((long)local_530.p +
                                     ((lVar33 + 1) - lVar38) * local_530.kstride * 4 + lVar39);
                    local_5f8.p[lVar34 + lVar35 + lVar20 + lVar17] =
                         ((double)iVar18 *
                          local_5f8.p
                          [lVar34 + lVar35 + lVar20 + ((lVar33 + 1) - lVar3) * local_5f8.kstride] +
                         (double)iVar8 *
                         local_5f8.p
                         [lVar34 + lVar35 + lVar20 + ((lVar33 + -1) - lVar3) * local_5f8.kstride] +
                         (double)iVar9 * local_5f8.p[lVar34 + lVar16 + lVar20 + lVar17] +
                         (double)iVar22 * local_5f8.p[lVar25 + lVar35 + lVar20 + lVar17]) /
                         (double)(iVar22 + iVar9 + iVar8 + iVar18);
                  }
LAB_004d4993:
                  lVar33 = lVar33 + 1;
                } while (uVar43 != (uint)lVar33);
                if (iVar4 <= iVar11) {
                  lVar15 = (long)(iVar23 - local_530.begin.x);
                  iVar9 = local_5b4 - local_530.begin.x;
                  lVar39 = lVar15 * 4 + (iVar12 - local_530.begin.y) * local_530.jstride * 4;
                  lVar3 = (long)(local_5b4 - local_5f8.begin.x);
                  lVar20 = (iVar12 - local_5f8.begin.y) * local_5f8.jstride;
                  lVar33 = (long)local_5f8.begin.z;
                  lVar25 = (iVar37 - local_5f8.begin.y) * local_5f8.jstride;
                  lVar34 = (long)(iVar23 - local_5f8.begin.x);
                  lVar16 = local_5f8.nstride * local_658;
                  local_5a8 = local_5f8.p + lVar20 + lVar3 + lVar16;
                  lVar40 = local_4b0;
                  do {
                    lVar35 = (lVar40 - lVar38) * local_530.kstride;
                    if (*(int *)((long)local_5b0 + lVar35 * 4 + lVar15 * 4) == 0) {
                      iVar8 = *(int *)((long)local_5b0 + lVar35 * 4 + (long)iVar9 * 4);
                      iVar22 = *(int *)((long)local_530.p + lVar35 * 4 + lVar39);
                      iVar18 = iVar22;
                      if ((iVar8 != 1) && (iVar18 = 1, iVar22 != 1)) {
                        lVar35 = ((lVar40 + -1) - lVar38) * local_530.kstride;
                        iVar18 = iVar22;
                        if (*(int *)((long)local_5b0 + lVar35 * 4 + lVar15 * 4) != 1) {
                          lVar17 = ((lVar40 + 1) - lVar38) * local_530.kstride;
                          if (*(int *)((long)local_5b0 + lVar17 * 4 + lVar15 * 4) != 1) {
                            iVar8 = *(int *)((long)local_5b0 + lVar35 * 4 + (long)iVar9 * 4);
                            lVar41 = ((lVar40 + -1) - lVar33) * local_5f8.kstride;
                            iVar22 = *(int *)((long)local_5b0 + lVar17 * 4 + (long)iVar9 * 4);
                            iVar18 = *(int *)((long)local_530.p + lVar35 * 4 + lVar39);
                            lVar35 = ((lVar40 + 1) - lVar33) * local_5f8.kstride;
                            iVar1 = *(int *)((long)local_530.p + lVar17 * 4 + lVar39);
                            lVar17 = (lVar40 - lVar33) * local_5f8.kstride;
                            local_5f8.p[lVar25 + lVar34 + lVar16 + lVar17] =
                                 ((double)iVar1 * local_5f8.p[lVar20 + lVar34 + lVar16 + lVar35] +
                                 (double)iVar18 * local_5f8.p[lVar20 + lVar34 + lVar16 + lVar41] +
                                 (double)iVar22 * local_5f8.p[lVar25 + lVar3 + lVar16 + lVar35] +
                                 (double)iVar8 * local_5f8.p[lVar25 + lVar3 + lVar16 + lVar41] +
                                 local_5a8[lVar17]) / (double)(iVar8 + iVar22 + iVar18 + iVar1 + 1);
                            goto LAB_004d4c85;
                          }
                        }
                      }
                      lVar35 = (lVar40 - lVar33) * local_5f8.kstride;
                      iVar22 = *(int *)((long)local_5b0 +
                                       ((lVar40 + -1) - lVar38) * local_530.kstride * 4 + lVar15 * 4
                                       );
                      iVar1 = *(int *)((long)local_5b0 +
                                      ((lVar40 + 1) - lVar38) * local_530.kstride * 4 + lVar15 * 4);
                      local_5f8.p[lVar25 + lVar34 + lVar16 + lVar35] =
                           ((double)iVar1 *
                            local_5f8.p
                            [lVar25 + lVar34 + lVar16 + ((lVar40 + 1) - lVar33) * local_5f8.kstride]
                           + (double)iVar22 *
                             local_5f8.p
                             [lVar25 + lVar34 + lVar16 + ((lVar40 + -1) - lVar33) *
                                                         local_5f8.kstride] +
                             (double)iVar8 * local_5f8.p[lVar25 + lVar3 + lVar16 + lVar35] +
                             (double)iVar18 * local_5f8.p[lVar20 + lVar34 + lVar16 + lVar35]) /
                           (double)(iVar18 + iVar8 + iVar22 + iVar1);
                    }
LAB_004d4c85:
                    lVar40 = lVar40 + 1;
                  } while (uVar43 != (uint)lVar40);
                  if (iVar4 <= iVar11) {
                    lVar39 = (long)(iVar13 - local_530.begin.x) * 4 + lVar19 * 4;
                    lVar40 = lVar46 * 4 + (iVar5 - local_530.begin.y) * local_530.jstride * 4;
                    lVar3 = (long)(iVar13 - local_5f8.begin.x);
                    lVar16 = (iVar5 - local_5f8.begin.y) * local_5f8.jstride;
                    lVar33 = (long)local_5f8.begin.z;
                    lVar20 = (iVar21 - local_5f8.begin.y) * local_5f8.jstride;
                    lVar25 = (long)(iVar42 - local_5f8.begin.x);
                    lVar34 = local_5f8.nstride * local_658;
                    local_5a8 = local_5f8.p + lVar16 + lVar3 + lVar34;
                    lVar15 = local_4b0;
                    do {
                      lVar35 = (lVar15 - lVar38) * local_530.kstride;
                      if (*(int *)((long)local_530.p + lVar35 * 4 + lVar10) == 0) {
                        iVar9 = *(int *)((long)local_530.p + lVar35 * 4 + lVar39);
                        iVar8 = *(int *)((long)local_530.p + lVar35 * 4 + lVar40);
                        iVar22 = iVar8;
                        if ((iVar9 != 1) && (iVar22 = 1, iVar8 != 1)) {
                          lVar35 = ((lVar15 + -1) - lVar38) * local_530.kstride;
                          iVar22 = iVar8;
                          if (*(int *)((long)local_530.p + lVar35 * 4 + lVar10) != 1) {
                            lVar17 = ((lVar15 + 1) - lVar38) * local_530.kstride;
                            if (*(int *)((long)local_530.p + lVar17 * 4 + lVar10) != 1) {
                              iVar9 = *(int *)((long)local_530.p + lVar35 * 4 + lVar39);
                              lVar41 = ((lVar15 + -1) - lVar33) * local_5f8.kstride;
                              iVar8 = *(int *)((long)local_530.p + lVar17 * 4 + lVar39);
                              iVar22 = *(int *)((long)local_530.p + lVar35 * 4 + lVar40);
                              lVar35 = ((lVar15 + 1) - lVar33) * local_5f8.kstride;
                              iVar18 = *(int *)((long)local_530.p + lVar17 * 4 + lVar40);
                              lVar17 = (lVar15 - lVar33) * local_5f8.kstride;
                              local_5f8.p[lVar20 + lVar25 + lVar34 + lVar17] =
                                   ((double)iVar18 * local_5f8.p[lVar16 + lVar25 + lVar34 + lVar35]
                                   + (double)iVar22 * local_5f8.p[lVar16 + lVar25 + lVar34 + lVar41]
                                     + (double)iVar8 * local_5f8.p[lVar20 + lVar3 + lVar34 + lVar35]
                                       + (double)iVar9 *
                                         local_5f8.p[lVar20 + lVar3 + lVar34 + lVar41] +
                                         local_5a8[lVar17]) /
                                   (double)(iVar9 + iVar8 + iVar22 + iVar18 + 1);
                              goto LAB_004d4f76;
                            }
                          }
                        }
                        lVar35 = (lVar15 - lVar33) * local_5f8.kstride;
                        iVar8 = *(int *)((long)local_530.p +
                                        ((lVar15 + -1) - lVar38) * local_530.kstride * 4 + lVar10);
                        iVar18 = *(int *)((long)local_530.p +
                                         ((lVar15 + 1) - lVar38) * local_530.kstride * 4 + lVar10);
                        local_5f8.p[lVar20 + lVar25 + lVar34 + lVar35] =
                             ((double)iVar18 *
                              local_5f8.p
                              [lVar20 + lVar25 + lVar34 + ((lVar15 + 1) - lVar33) *
                                                          local_5f8.kstride] +
                             (double)iVar8 *
                             local_5f8.p
                             [lVar20 + lVar25 + lVar34 + ((lVar15 + -1) - lVar33) *
                                                         local_5f8.kstride] +
                             (double)iVar9 * local_5f8.p[lVar20 + lVar3 + lVar34 + lVar35] +
                             (double)iVar22 * local_5f8.p[lVar16 + lVar25 + lVar34 + lVar35]) /
                             (double)(iVar22 + iVar9 + iVar8 + iVar18);
                      }
LAB_004d4f76:
                      lVar15 = lVar15 + 1;
                    } while (uVar43 != (uint)lVar15);
                    if (iVar4 <= iVar11) {
                      iVar9 = iVar13 - local_530.begin.x;
                      lVar10 = lVar46 * 4 + (iVar12 - local_530.begin.y) * local_530.jstride * 4;
                      lVar15 = (long)(iVar13 - local_5f8.begin.x);
                      lVar33 = (iVar12 - local_5f8.begin.y) * local_5f8.jstride;
                      lVar40 = (long)local_5f8.begin.z;
                      lVar3 = (iVar37 - local_5f8.begin.y) * local_5f8.jstride;
                      lVar16 = (long)(iVar42 - local_5f8.begin.x);
                      lVar20 = local_5f8.nstride * local_658;
                      lVar39 = local_4b0;
                      do {
                        lVar25 = (lVar39 - lVar38) * local_530.kstride;
                        if (*(int *)((long)local_5b0 + lVar25 * 4 + lVar46 * 4) == 0) {
                          iVar8 = *(int *)((long)local_5b0 + lVar25 * 4 + (long)iVar9 * 4);
                          iVar22 = *(int *)((long)local_530.p + lVar25 * 4 + lVar10);
                          iVar18 = iVar22;
                          if ((iVar8 != 1) && (iVar18 = 1, iVar22 != 1)) {
                            lVar25 = ((lVar39 + -1) - lVar38) * local_530.kstride;
                            iVar18 = iVar22;
                            if (*(int *)((long)local_5b0 + lVar25 * 4 + lVar46 * 4) != 1) {
                              lVar34 = ((lVar39 + 1) - lVar38) * local_530.kstride;
                              if (*(int *)((long)local_5b0 + lVar34 * 4 + lVar46 * 4) != 1) {
                                iVar8 = *(int *)((long)local_5b0 + lVar25 * 4 + (long)iVar9 * 4);
                                lVar35 = ((lVar39 + -1) - lVar40) * local_5f8.kstride;
                                iVar22 = *(int *)((long)local_5b0 + lVar34 * 4 + (long)iVar9 * 4);
                                iVar18 = *(int *)((long)local_530.p + lVar25 * 4 + lVar10);
                                lVar25 = ((lVar39 + 1) - lVar40) * local_5f8.kstride;
                                iVar1 = *(int *)((long)local_530.p + lVar34 * 4 + lVar10);
                                lVar34 = (lVar39 - lVar40) * local_5f8.kstride;
                                local_5f8.p[lVar3 + lVar16 + lVar20 + lVar34] =
                                     ((double)iVar1 * local_5f8.p[lVar33 + lVar16 + lVar20 + lVar25]
                                     + (double)iVar18 *
                                       local_5f8.p[lVar33 + lVar16 + lVar20 + lVar35] +
                                       (double)iVar22 *
                                       local_5f8.p[lVar3 + lVar15 + lVar20 + lVar25] +
                                       (double)iVar8 * local_5f8.p[lVar3 + lVar15 + lVar20 + lVar35]
                                       + local_5f8.p[lVar33 + lVar15 + lVar20 + lVar34]) /
                                     (double)(iVar8 + iVar22 + iVar18 + iVar1 + 1);
                                goto LAB_004d7a2c;
                              }
                            }
                          }
                          lVar25 = (lVar39 - lVar40) * local_5f8.kstride;
                          iVar22 = *(int *)((long)local_5b0 +
                                           ((lVar39 + -1) - lVar38) * local_530.kstride * 4 +
                                           lVar46 * 4);
                          iVar1 = *(int *)((long)local_5b0 +
                                          ((lVar39 + 1) - lVar38) * local_530.kstride * 4 +
                                          lVar46 * 4);
                          local_5f8.p[lVar3 + lVar16 + lVar20 + lVar25] =
                               ((double)iVar1 *
                                local_5f8.p
                                [lVar3 + lVar16 + lVar20 + ((lVar39 + 1) - lVar40) *
                                                           local_5f8.kstride] +
                               (double)iVar22 *
                               local_5f8.p
                               [lVar3 + lVar16 + lVar20 + ((lVar39 + -1) - lVar40) *
                                                          local_5f8.kstride] +
                               (double)iVar8 * local_5f8.p[lVar3 + lVar15 + lVar20 + lVar25] +
                               (double)iVar18 * local_5f8.p[lVar33 + lVar16 + lVar20 + lVar25]) /
                               (double)(iVar18 + iVar8 + iVar22 + iVar1);
                        }
LAB_004d7a2c:
                        lVar39 = lVar39 + 1;
                      } while (uVar43 != (uint)lVar39);
                    }
                  }
                }
              }
              if (iVar5 <= iVar12) {
                lVar40 = (long)(iVar23 - local_530.begin.x);
                lVar38 = (long)(local_5b4 - local_530.begin.x);
                lVar39 = (iVar4 - local_530.begin.z) * local_530.kstride;
                local_4c8 = local_5f8.jstride;
                local_5b0 = (double *)(long)(local_5b4 - local_5f8.begin.x);
                local_4d0 = (double *)(long)local_5f8.begin.y;
                local_5a8 = (double *)((iVar28 - local_5f8.begin.z) * local_5f8.kstride);
                local_4d8 = local_5f8.nstride * local_658;
                local_588 = (iVar4 - local_5f8.begin.z) * local_5f8.kstride;
                local_540 = (double *)(long)(iVar23 - local_5f8.begin.x);
                local_3d0 = (long)local_530.p + lVar32 * 4 + lVar40 * 4;
                local_3d8 = local_5f8.p + (long)local_540 + (long)((long)local_5a8 + local_4d8);
                lVar10 = local_4a8;
                do {
                  lVar33 = (lVar10 - lVar45) * local_530.jstride;
                  lVar15 = lVar40 * 4 + lVar33 * 4;
                  if (*(int *)((long)local_530.p + lVar32 * 4 + lVar15) == 0) {
                    iVar9 = *(int *)((long)local_530.p + lVar32 * 4 + lVar38 * 4 + lVar33 * 4);
                    lVar33 = lVar10 + -1;
                    lVar3 = (lVar33 - lVar45) * local_530.jstride;
                    if (iVar9 != 1) {
                      lVar16 = lVar40 * 4 + lVar3 * 4;
                      if (*(int *)((long)local_530.p + lVar32 * 4 + lVar16) != 1) {
                        lVar25 = ((lVar10 + 1) - lVar45) * local_530.jstride;
                        lVar20 = lVar40 * 4 + lVar25 * 4;
                        if ((*(int *)((long)local_530.p + lVar32 * 4 + lVar20) != 1) &&
                           (*(int *)((long)local_530.p + lVar39 * 4 + lVar15) != 1)) {
                          iVar9 = *(int *)((long)local_530.p + lVar32 * 4 + lVar38 * 4 + lVar3 * 4);
                          lVar3 = (lVar33 - (long)local_4d0) * local_5f8.jstride;
                          local_48c = *(int *)((long)local_530.p +
                                              lVar32 * 4 + lVar38 * 4 + lVar25 * 4);
                          lVar33 = ((lVar10 + 1) - (long)local_4d0) * local_5f8.jstride;
                          lVar15 = (lVar10 - (long)local_4d0) * local_5f8.jstride;
                          iVar8 = *(int *)((long)local_530.p + lVar39 * 4 + lVar16);
                          iVar22 = *(int *)((long)local_530.p + lVar39 * 4 + lVar20);
                          local_5f8.p[(long)local_540 + (long)local_5a8 + lVar15 + local_4d8] =
                               ((double)iVar22 *
                                local_5f8.p[(long)local_540 + lVar33 + local_588 + local_4d8] +
                               (double)iVar8 *
                               local_5f8.p[(long)local_540 + lVar3 + local_588 + local_4d8] +
                               (double)iVar9 *
                               local_5f8.p[(long)local_5b0 + (long)local_5a8 + lVar3 + local_4d8] +
                               (double)local_48c *
                               local_5f8.p[(long)local_5b0 + (long)local_5a8 + lVar33 + local_4d8] +
                               local_5f8.p[(long)local_5b0 + lVar15 + local_588 + local_4d8]) /
                               (double)(iVar9 + local_48c + iVar8 + iVar22 + 1);
                          goto LAB_004d5381;
                        }
                      }
                    }
                    lVar16 = (lVar10 - (long)local_4d0) * local_5f8.jstride;
                    iVar8 = *(int *)(local_3d0 + lVar3 * 4);
                    iVar22 = *(int *)(local_3d0 + ((lVar10 - lVar45) + 1) * local_530.jstride * 4);
                    iVar18 = *(int *)((long)local_530.p + lVar39 * 4 + lVar15);
                    local_5f8.p[(long)local_540 + (long)local_5a8 + lVar16 + local_4d8] =
                         ((double)iVar18 *
                          local_5f8.p[(long)local_540 + lVar16 + local_588 + local_4d8] +
                         (double)iVar22 *
                         local_3d8[((lVar10 + 1) - (long)local_4d0) * local_5f8.jstride] +
                         (double)iVar9 *
                         local_5f8.p[(long)local_5b0 + (long)local_5a8 + lVar16 + local_4d8] +
                         (double)iVar8 * local_3d8[(lVar33 - (long)local_4d0) * local_5f8.jstride])
                         / (double)(iVar8 + iVar22 + iVar9 + iVar18);
                  }
LAB_004d5381:
                  lVar10 = lVar10 + 1;
                } while (uVar44 != (uint)lVar10);
                if (iVar5 <= iVar12) {
                  lVar40 = (long)(iVar23 - local_530.begin.x);
                  lVar38 = (long)(local_5b4 - local_530.begin.x);
                  lVar39 = (iVar11 - local_530.begin.z) * local_530.kstride;
                  local_5b0 = (double *)(long)(local_5b4 - local_5f8.begin.x);
                  local_4d0 = (double *)(long)local_5f8.begin.y;
                  local_5a8 = (double *)((iVar36 - local_5f8.begin.z) * local_5f8.kstride);
                  local_4d8 = local_5f8.nstride * local_658;
                  local_588 = (iVar11 - local_5f8.begin.z) * local_5f8.kstride;
                  local_540 = (double *)(long)(iVar23 - local_5f8.begin.x);
                  local_3d0 = (long)local_530.p + lVar29 * 4 + lVar40 * 4;
                  local_3d8 = local_5f8.p + (long)local_540 + (long)((long)local_5a8 + local_4d8);
                  lVar10 = local_4a8;
                  do {
                    lVar33 = (lVar10 - lVar45) * local_530.jstride;
                    lVar15 = lVar40 * 4 + lVar33 * 4;
                    if (*(int *)((long)local_530.p + lVar29 * 4 + lVar15) == 0) {
                      iVar9 = *(int *)((long)local_530.p + lVar29 * 4 + lVar38 * 4 + lVar33 * 4);
                      lVar33 = lVar10 + -1;
                      lVar3 = (lVar33 - lVar45) * local_530.jstride;
                      if (iVar9 != 1) {
                        lVar16 = lVar40 * 4 + lVar3 * 4;
                        if (*(int *)((long)local_530.p + lVar29 * 4 + lVar16) != 1) {
                          lVar25 = ((lVar10 + 1) - lVar45) * local_530.jstride;
                          lVar20 = lVar40 * 4 + lVar25 * 4;
                          if ((*(int *)((long)local_530.p + lVar29 * 4 + lVar20) != 1) &&
                             (*(int *)((long)local_530.p + lVar39 * 4 + lVar15) != 1)) {
                            iVar9 = *(int *)((long)local_530.p + lVar29 * 4 + lVar38 * 4 + lVar3 * 4
                                            );
                            lVar3 = (lVar33 - (long)local_4d0) * local_5f8.jstride;
                            local_48c = *(int *)((long)local_530.p +
                                                lVar29 * 4 + lVar38 * 4 + lVar25 * 4);
                            lVar33 = ((lVar10 + 1) - (long)local_4d0) * local_5f8.jstride;
                            lVar15 = (lVar10 - (long)local_4d0) * local_5f8.jstride;
                            iVar8 = *(int *)((long)local_530.p + lVar39 * 4 + lVar16);
                            iVar22 = *(int *)((long)local_530.p + lVar39 * 4 + lVar20);
                            local_5f8.p[(long)local_540 + (long)local_5a8 + lVar15 + local_4d8] =
                                 ((double)iVar22 *
                                  local_5f8.p[(long)local_540 + lVar33 + local_588 + local_4d8] +
                                 (double)iVar8 *
                                 local_5f8.p[(long)local_540 + lVar3 + local_588 + local_4d8] +
                                 (double)iVar9 *
                                 local_5f8.p[(long)local_5b0 + (long)local_5a8 + lVar3 + local_4d8]
                                 + (double)local_48c *
                                   local_5f8.p
                                   [(long)local_5b0 + (long)local_5a8 + lVar33 + local_4d8] +
                                 local_5f8.p[(long)local_5b0 + lVar15 + local_588 + local_4d8]) /
                                 (double)(iVar9 + local_48c + iVar8 + iVar22 + 1);
                            goto LAB_004d57ce;
                          }
                        }
                      }
                      lVar16 = (lVar10 - (long)local_4d0) * local_5f8.jstride;
                      iVar8 = *(int *)(local_3d0 + lVar3 * 4);
                      iVar22 = *(int *)(local_3d0 + ((lVar10 - lVar45) + 1) * local_530.jstride * 4)
                      ;
                      iVar18 = *(int *)((long)local_530.p + lVar39 * 4 + lVar15);
                      local_5f8.p[(long)local_540 + (long)local_5a8 + lVar16 + local_4d8] =
                           ((double)iVar18 *
                            local_5f8.p[(long)local_540 + lVar16 + local_588 + local_4d8] +
                           (double)iVar22 *
                           local_3d8[((lVar10 + 1) - (long)local_4d0) * local_5f8.jstride] +
                           (double)iVar9 *
                           local_5f8.p[(long)local_5b0 + (long)local_5a8 + lVar16 + local_4d8] +
                           (double)iVar8 * local_3d8[(lVar33 - (long)local_4d0) * local_5f8.jstride]
                           ) / (double)(iVar8 + iVar22 + iVar9 + iVar18);
                    }
LAB_004d57ce:
                    lVar10 = lVar10 + 1;
                  } while (uVar44 != (uint)lVar10);
                  if (iVar5 <= iVar12) {
                    lVar38 = (long)(iVar13 - local_530.begin.x);
                    lVar39 = (iVar4 - local_530.begin.z) * local_530.kstride;
                    local_5b0 = (double *)(long)(iVar13 - local_5f8.begin.x);
                    lVar15 = (long)local_5f8.begin.y;
                    lVar40 = (iVar28 - local_5f8.begin.z) * local_5f8.kstride;
                    lVar33 = local_5f8.nstride * local_658;
                    local_5a8 = (double *)((iVar4 - local_5f8.begin.z) * local_5f8.kstride);
                    local_588 = (long)(iVar42 - local_5f8.begin.x);
                    local_4d8 = (long)local_530.p + lVar46 * 4;
                    local_4c8 = local_4d8 + lVar32 * 4;
                    local_540 = local_5f8.p;
                    local_4d0 = local_5f8.p + local_588 + lVar40 + lVar33;
                    lVar10 = local_4a8;
                    do {
                      lVar16 = (lVar10 - lVar45) * local_530.jstride;
                      lVar3 = lVar46 * 4 + lVar16 * 4;
                      if (*(int *)((long)local_530.p + lVar32 * 4 + lVar3) == 0) {
                        iVar9 = *(int *)((long)local_530.p + lVar32 * 4 + lVar38 * 4 + lVar16 * 4);
                        lVar16 = lVar10 + -1;
                        lVar20 = (lVar16 - lVar45) * local_530.jstride;
                        if (iVar9 != 1) {
                          lVar25 = lVar46 * 4 + lVar20 * 4;
                          if (*(int *)((long)local_530.p + lVar32 * 4 + lVar25) != 1) {
                            lVar35 = ((lVar10 + 1) - lVar45) * local_530.jstride;
                            lVar34 = lVar46 * 4 + lVar35 * 4;
                            if ((*(int *)((long)local_530.p + lVar32 * 4 + lVar34) != 1) &&
                               (*(int *)((long)local_530.p + lVar39 * 4 + lVar3) != 1)) {
                              iVar9 = *(int *)((long)local_530.p +
                                              lVar32 * 4 + lVar38 * 4 + lVar20 * 4);
                              lVar16 = (lVar16 - lVar15) * local_5f8.jstride;
                              iVar8 = *(int *)((long)local_530.p +
                                              lVar32 * 4 + lVar38 * 4 + lVar35 * 4);
                              lVar3 = ((lVar10 + 1) - lVar15) * local_5f8.jstride;
                              lVar20 = (lVar10 - lVar15) * local_5f8.jstride;
                              iVar22 = *(int *)((long)local_530.p + lVar39 * 4 + lVar25);
                              iVar18 = *(int *)((long)local_530.p + lVar39 * 4 + lVar34);
                              local_5f8.p[lVar20 + local_588 + lVar40 + lVar33] =
                                   ((double)iVar18 *
                                    local_5f8.p[(long)local_5a8 + lVar3 + local_588 + lVar33] +
                                   (double)iVar22 *
                                   local_5f8.p[(long)local_5a8 + lVar16 + local_588 + lVar33] +
                                   (double)iVar9 *
                                   local_5f8.p[(long)local_5b0 + lVar16 + lVar40 + lVar33] +
                                   (double)iVar8 *
                                   local_5f8.p[(long)local_5b0 + lVar3 + lVar40 + lVar33] +
                                   local_5f8.p[(long)local_5b0 + (long)local_5a8 + lVar20 + lVar33])
                                   / (double)(iVar9 + iVar8 + iVar22 + iVar18 + 1);
                              goto LAB_004d5bdf;
                            }
                          }
                        }
                        lVar25 = (lVar10 - lVar15) * local_5f8.jstride;
                        iVar8 = *(int *)(local_4c8 + lVar20 * 4);
                        iVar22 = *(int *)(local_4c8 +
                                         ((lVar10 - lVar45) + 1) * local_530.jstride * 4);
                        iVar18 = *(int *)((long)local_530.p + lVar39 * 4 + lVar3);
                        local_5f8.p[lVar25 + local_588 + lVar40 + lVar33] =
                             ((double)iVar18 *
                              local_5f8.p[(long)local_5a8 + lVar25 + local_588 + lVar33] +
                             (double)iVar22 * local_4d0[((lVar10 + 1) - lVar15) * local_5f8.jstride]
                             + (double)iVar9 *
                               local_5f8.p[(long)local_5b0 + lVar25 + lVar40 + lVar33] +
                               (double)iVar8 * local_4d0[(lVar16 - lVar15) * local_5f8.jstride]) /
                             (double)(iVar8 + iVar22 + iVar9 + iVar18);
                      }
LAB_004d5bdf:
                      lVar10 = lVar10 + 1;
                    } while (uVar44 != (uint)lVar10);
                    if (iVar5 <= iVar12) {
                      lVar38 = (long)(iVar13 - local_530.begin.x);
                      lVar39 = (iVar11 - local_530.begin.z) * local_530.kstride;
                      lVar40 = (long)(iVar13 - local_5f8.begin.x);
                      lVar15 = (long)local_5f8.begin.y;
                      local_5b0 = (double *)((iVar36 - local_5f8.begin.z) * local_5f8.kstride);
                      lVar33 = local_5f8.nstride * local_658;
                      local_5a8 = (double *)((iVar11 - local_5f8.begin.z) * local_5f8.kstride);
                      local_588 = (long)(iVar42 - local_5f8.begin.x);
                      local_4c8 = local_4d8 + lVar29 * 4;
                      local_4d0 = local_5f8.p + (long)local_5b0 + local_588 + lVar33;
                      lVar10 = local_4a8;
                      do {
                        lVar16 = (lVar10 - lVar45) * local_530.jstride;
                        lVar3 = lVar46 * 4 + lVar16 * 4;
                        if (*(int *)((long)local_530.p + lVar29 * 4 + lVar3) == 0) {
                          iVar9 = *(int *)((long)local_530.p + lVar29 * 4 + lVar38 * 4 + lVar16 * 4)
                          ;
                          lVar16 = lVar10 + -1;
                          lVar20 = (lVar16 - lVar45) * local_530.jstride;
                          if (iVar9 != 1) {
                            lVar25 = lVar46 * 4 + lVar20 * 4;
                            if (*(int *)((long)local_530.p + lVar29 * 4 + lVar25) != 1) {
                              lVar35 = ((lVar10 + 1) - lVar45) * local_530.jstride;
                              lVar34 = (long)local_530.p + lVar46 * 4 + lVar35 * 4;
                              if ((*(int *)(lVar34 + lVar29 * 4) != 1) &&
                                 (*(int *)((long)local_530.p + lVar39 * 4 + lVar3) != 1)) {
                                iVar9 = *(int *)((long)local_530.p +
                                                lVar29 * 4 + lVar38 * 4 + lVar20 * 4);
                                lVar20 = (lVar16 - lVar15) * local_5f8.jstride;
                                iVar8 = *(int *)((long)local_530.p +
                                                lVar29 * 4 + lVar38 * 4 + lVar35 * 4);
                                lVar16 = ((lVar10 + 1) - lVar15) * local_5f8.jstride;
                                lVar3 = (lVar10 - lVar15) * local_5f8.jstride;
                                iVar22 = *(int *)((long)local_530.p + lVar39 * 4 + lVar25);
                                iVar18 = *(int *)(lVar34 + lVar39 * 4);
                                local_5f8.p[(long)local_5b0 + lVar3 + local_588 + lVar33] =
                                     ((double)iVar18 *
                                      local_5f8.p[(long)local_5a8 + lVar16 + local_588 + lVar33] +
                                     (double)iVar22 *
                                     local_5f8.p[(long)local_5a8 + lVar20 + local_588 + lVar33] +
                                     (double)iVar9 *
                                     local_5f8.p[(long)local_5b0 + lVar20 + lVar40 + lVar33] +
                                     (double)iVar8 *
                                     local_5f8.p[(long)local_5b0 + lVar16 + lVar40 + lVar33] +
                                     local_5f8.p[(long)local_5a8 + lVar3 + lVar40 + lVar33]) /
                                     (double)(iVar9 + iVar8 + iVar22 + iVar18 + 1);
                                local_4d8 = lVar34;
                                goto LAB_004d7de1;
                              }
                            }
                          }
                          lVar25 = (lVar10 - lVar15) * local_5f8.jstride;
                          iVar8 = *(int *)(local_4c8 + lVar20 * 4);
                          iVar22 = *(int *)(local_4c8 +
                                           ((lVar10 - lVar45) + 1) * local_530.jstride * 4);
                          iVar18 = *(int *)((long)local_530.p + lVar39 * 4 + lVar3);
                          local_5f8.p[(long)local_5b0 + lVar25 + local_588 + lVar33] =
                               ((double)iVar18 *
                                local_5f8.p[(long)local_5a8 + lVar25 + local_588 + lVar33] +
                               (double)iVar22 *
                               local_4d0[((lVar10 + 1) - lVar15) * local_5f8.jstride] +
                               (double)iVar9 *
                               local_5f8.p[(long)local_5b0 + lVar25 + lVar40 + lVar33] +
                               (double)iVar8 * local_4d0[(lVar16 - lVar15) * local_5f8.jstride]) /
                               (double)(iVar8 + iVar22 + iVar9 + iVar18);
                        }
LAB_004d7de1:
                        lVar10 = lVar10 + 1;
                      } while (uVar44 != (uint)lVar10);
                    }
                  }
                }
              }
              if (local_5b4 <= iVar13) {
                lVar10 = lVar32 * 4 + local_530.jstride * (iVar5 - local_530.begin.y) * 4;
                lVar45 = (iVar4 - local_530.begin.z) * local_530.kstride;
                lVar15 = (long)local_5f8.begin.x;
                lVar39 = (iVar5 - local_5f8.begin.y) * local_5f8.jstride;
                lVar33 = (iVar28 - local_5f8.begin.z) * local_5f8.kstride;
                lVar3 = local_5f8.nstride * local_658;
                lVar46 = (iVar21 - local_5f8.begin.y) * local_5f8.jstride;
                lVar40 = (iVar4 - local_5f8.begin.z) * local_5f8.kstride;
                local_5b0 = local_5f8.p + lVar46 + lVar40 + lVar3;
                local_5a8 = local_5f8.p + lVar39 + lVar40 + lVar3;
                lVar38 = local_4a0;
                do {
                  lVar20 = lVar38 - lVar31;
                  lVar16 = lVar20 * 4 + lVar19 * 4;
                  if (*(int *)((long)local_530.p + lVar32 * 4 + lVar16) == 0) {
                    lVar25 = lVar38 + -1;
                    lVar35 = (lVar25 - lVar31) * 4 + lVar19 * 4;
                    iVar9 = *(int *)((long)local_530.p + lVar32 * 4 + lVar35);
                    lVar34 = lVar38 + 1;
                    lVar17 = lVar34 - lVar31;
                    if ((((iVar9 == 1) ||
                         (lVar41 = lVar17 * 4 + lVar19 * 4,
                         *(int *)((long)local_530.p + lVar32 * 4 + lVar41) == 1)) ||
                        (*(int *)((long)local_530.p + lVar20 * 4 + lVar10) == 1)) ||
                       (*(int *)((long)local_530.p + lVar45 * 4 + lVar16) == 1)) {
                      iVar8 = *(int *)((long)local_530.p + lVar17 * 4 + lVar32 * 4 + lVar19 * 4);
                      iVar22 = *(int *)((long)local_530.p + lVar20 * 4 + lVar10);
                      lVar20 = lVar38 - lVar15;
                      iVar18 = *(int *)((long)local_530.p + lVar45 * 4 + lVar16);
                      local_5f8.p[lVar46 + lVar20 + lVar33 + lVar3] =
                           ((double)iVar18 * local_5f8.p[lVar46 + lVar20 + lVar40 + lVar3] +
                           (double)iVar22 * local_5f8.p[lVar39 + lVar33 + lVar3 + lVar20] +
                           (double)iVar9 * local_5f8.p[lVar46 + lVar33 + lVar3 + (lVar25 - lVar15)]
                           + (double)iVar8 *
                             local_5f8.p[lVar46 + lVar33 + lVar3 + (lVar34 - lVar15)]) /
                           (double)(iVar8 + iVar22 + iVar9 + iVar18);
                    }
                    else {
                      iVar9 = *(int *)((long)local_530.p + (lVar25 - lVar31) * 4 + lVar10);
                      iVar8 = *(int *)((long)local_530.p + lVar17 * 4 + lVar10);
                      iVar22 = *(int *)((long)local_530.p + lVar45 * 4 + lVar35);
                      iVar18 = *(int *)((long)local_530.p + lVar45 * 4 + lVar41);
                      local_5f8.p[lVar46 + lVar33 + lVar3 + (lVar38 - lVar15)] =
                           ((double)iVar18 * local_5b0[lVar34 - lVar15] +
                            (double)iVar22 * local_5b0[lVar25 - lVar15] +
                            (double)iVar9 * local_5f8.p[lVar39 + lVar33 + lVar3 + (lVar25 - lVar15)]
                            + (double)iVar8 *
                              local_5f8.p[lVar39 + lVar33 + lVar3 + (lVar34 - lVar15)] +
                           local_5a8[lVar38 - lVar15]) /
                           (double)(iVar18 + iVar9 + iVar8 + iVar22 + 1);
                    }
                  }
                  lVar38 = lVar38 + 1;
                } while (uVar7 != (uint)lVar38);
                if (local_5b4 <= iVar13) {
                  lVar31 = (long)local_530.begin.x;
                  lVar46 = (iVar21 - local_530.begin.y) * local_530.jstride;
                  lVar10 = lVar29 * 4 + (iVar5 - local_530.begin.y) * local_530.jstride * 4;
                  lVar38 = (iVar11 - local_530.begin.z) * local_530.kstride;
                  lVar15 = (long)local_5f8.begin.x;
                  lVar39 = (iVar5 - local_5f8.begin.y) * local_5f8.jstride;
                  lVar3 = (iVar36 - local_5f8.begin.z) * local_5f8.kstride;
                  lVar33 = local_5f8.nstride * local_658;
                  lVar45 = (iVar21 - local_5f8.begin.y) * local_5f8.jstride;
                  lVar40 = (iVar11 - local_5f8.begin.z) * local_5f8.kstride;
                  local_5b0 = local_5f8.p + lVar39 + lVar40 + lVar33;
                  lVar19 = local_4a0;
                  do {
                    lVar20 = lVar19 - lVar31;
                    lVar16 = lVar20 * 4 + lVar46 * 4;
                    if (*(int *)((long)local_530.p + lVar29 * 4 + lVar16) == 0) {
                      lVar25 = lVar19 + -1;
                      lVar35 = (lVar25 - lVar31) * 4 + lVar46 * 4;
                      iVar9 = *(int *)((long)local_530.p + lVar29 * 4 + lVar35);
                      lVar34 = lVar19 + 1;
                      lVar17 = lVar34 - lVar31;
                      if (((iVar9 == 1) ||
                          (lVar41 = lVar17 * 4 + lVar46 * 4,
                          *(int *)((long)local_530.p + lVar29 * 4 + lVar41) == 1)) ||
                         ((*(int *)((long)local_530.p + lVar20 * 4 + lVar10) == 1 ||
                          (*(int *)((long)local_530.p + lVar38 * 4 + lVar16) == 1)))) {
                        iVar8 = *(int *)((long)local_530.p + lVar17 * 4 + lVar29 * 4 + lVar46 * 4);
                        iVar22 = *(int *)((long)local_530.p + lVar20 * 4 + lVar10);
                        lVar20 = lVar19 - lVar15;
                        iVar18 = *(int *)((long)local_530.p + lVar38 * 4 + lVar16);
                        local_5f8.p[lVar45 + lVar20 + lVar3 + lVar33] =
                             ((double)iVar18 * local_5f8.p[lVar45 + lVar20 + lVar40 + lVar33] +
                             (double)iVar22 * local_5f8.p[lVar39 + lVar3 + lVar33 + lVar20] +
                             (double)iVar9 *
                             local_5f8.p[lVar45 + lVar3 + lVar33 + (lVar25 - lVar15)] +
                             (double)iVar8 *
                             local_5f8.p[lVar45 + lVar3 + lVar33 + (lVar34 - lVar15)]) /
                             (double)(iVar8 + iVar22 + iVar9 + iVar18);
                      }
                      else {
                        iVar9 = *(int *)((long)local_530.p + (lVar25 - lVar31) * 4 + lVar10);
                        iVar8 = *(int *)((long)local_530.p + lVar17 * 4 + lVar10);
                        iVar22 = *(int *)((long)local_530.p + lVar38 * 4 + lVar35);
                        iVar18 = *(int *)((long)local_530.p + lVar38 * 4 + lVar41);
                        local_5f8.p[lVar45 + lVar3 + lVar33 + (lVar19 - lVar15)] =
                             ((double)iVar18 *
                              local_5f8.p[lVar45 + lVar40 + lVar33 + (lVar34 - lVar15)] +
                              (double)iVar22 *
                              local_5f8.p[lVar45 + lVar40 + lVar33 + (lVar25 - lVar15)] +
                              (double)iVar9 *
                              local_5f8.p[lVar39 + lVar3 + lVar33 + (lVar25 - lVar15)] +
                              (double)iVar8 *
                              local_5f8.p[lVar39 + lVar3 + lVar33 + (lVar34 - lVar15)] +
                             local_5b0[lVar19 - lVar15]) /
                             (double)(iVar9 + iVar8 + iVar22 + iVar18 + 1);
                      }
                    }
                    lVar19 = lVar19 + 1;
                  } while (uVar7 != (uint)lVar19);
                  if (local_5b4 <= iVar13) {
                    lVar31 = (long)local_530.begin.x;
                    lVar46 = (iVar37 - local_530.begin.y) * local_530.jstride;
                    lVar10 = lVar32 * 4 + (iVar12 - local_530.begin.y) * local_530.jstride * 4;
                    lVar38 = (iVar4 - local_530.begin.z) * local_530.kstride;
                    lVar15 = (long)local_5f8.begin.x;
                    lVar39 = (iVar12 - local_5f8.begin.y) * local_5f8.jstride;
                    lVar3 = (iVar28 - local_5f8.begin.z) * local_5f8.kstride;
                    lVar33 = local_5f8.nstride * local_658;
                    lVar45 = (iVar37 - local_5f8.begin.y) * local_5f8.jstride;
                    lVar40 = (iVar4 - local_5f8.begin.z) * local_5f8.kstride;
                    local_5b0 = local_5f8.p + lVar39 + lVar40 + lVar33;
                    lVar19 = local_4a0;
                    do {
                      lVar20 = lVar19 - lVar31;
                      lVar16 = lVar20 * 4 + lVar46 * 4;
                      if (*(int *)((long)local_530.p + lVar32 * 4 + lVar16) == 0) {
                        lVar25 = lVar19 + -1;
                        lVar35 = (lVar25 - lVar31) * 4 + lVar46 * 4;
                        iVar9 = *(int *)((long)local_530.p + lVar32 * 4 + lVar35);
                        lVar34 = lVar19 + 1;
                        lVar17 = lVar34 - lVar31;
                        if (((iVar9 == 1) ||
                            (lVar41 = lVar17 * 4 + lVar46 * 4,
                            *(int *)((long)local_530.p + lVar32 * 4 + lVar41) == 1)) ||
                           ((*(int *)((long)local_530.p + lVar20 * 4 + lVar10) == 1 ||
                            (*(int *)((long)local_530.p + lVar38 * 4 + lVar16) == 1)))) {
                          iVar8 = *(int *)((long)local_530.p + lVar17 * 4 + lVar32 * 4 + lVar46 * 4)
                          ;
                          iVar22 = *(int *)((long)local_530.p + lVar20 * 4 + lVar10);
                          lVar20 = lVar19 - lVar15;
                          iVar18 = *(int *)((long)local_530.p + lVar38 * 4 + lVar16);
                          local_5f8.p[lVar45 + lVar20 + lVar3 + lVar33] =
                               ((double)iVar18 * local_5f8.p[lVar45 + lVar20 + lVar40 + lVar33] +
                               (double)iVar22 * local_5f8.p[lVar39 + lVar3 + lVar33 + lVar20] +
                               (double)iVar9 *
                               local_5f8.p[lVar45 + lVar3 + lVar33 + (lVar25 - lVar15)] +
                               (double)iVar8 *
                               local_5f8.p[lVar45 + lVar3 + lVar33 + (lVar34 - lVar15)]) /
                               (double)(iVar8 + iVar22 + iVar9 + iVar18);
                        }
                        else {
                          iVar9 = *(int *)((long)local_530.p + (lVar25 - lVar31) * 4 + lVar10);
                          iVar8 = *(int *)((long)local_530.p + lVar17 * 4 + lVar10);
                          iVar22 = *(int *)((long)local_530.p + lVar38 * 4 + lVar35);
                          iVar18 = *(int *)((long)local_530.p + lVar38 * 4 + lVar41);
                          local_5f8.p[lVar45 + lVar3 + lVar33 + (lVar19 - lVar15)] =
                               ((double)iVar18 *
                                local_5f8.p[lVar45 + lVar40 + lVar33 + (lVar34 - lVar15)] +
                                (double)iVar22 *
                                local_5f8.p[lVar45 + lVar40 + lVar33 + (lVar25 - lVar15)] +
                                (double)iVar9 *
                                local_5f8.p[lVar39 + lVar3 + lVar33 + (lVar25 - lVar15)] +
                                (double)iVar8 *
                                local_5f8.p[lVar39 + lVar3 + lVar33 + (lVar34 - lVar15)] +
                               local_5b0[lVar19 - lVar15]) /
                               (double)(iVar9 + iVar8 + iVar22 + iVar18 + 1);
                        }
                      }
                      lVar19 = lVar19 + 1;
                    } while (uVar7 != (uint)lVar19);
                    if (local_5b4 <= iVar13) {
                      lVar31 = (long)local_530.begin.x;
                      lVar45 = (iVar37 - local_530.begin.y) * local_530.jstride;
                      lVar10 = lVar29 * 4 + (iVar12 - local_530.begin.y) * local_530.jstride * 4;
                      lVar46 = local_530.kstride * (iVar11 - local_530.begin.z);
                      lVar39 = (long)local_5f8.begin.x;
                      lVar32 = (iVar12 - local_5f8.begin.y) * local_5f8.jstride;
                      lVar33 = (iVar36 - local_5f8.begin.z) * local_5f8.kstride;
                      lVar15 = local_5f8.nstride * local_658;
                      lVar38 = (iVar37 - local_5f8.begin.y) * local_5f8.jstride;
                      lVar40 = (iVar11 - local_5f8.begin.z) * local_5f8.kstride;
                      lVar19 = local_4a0;
                      do {
                        lVar16 = lVar19 - lVar31;
                        lVar3 = lVar16 * 4 + lVar45 * 4;
                        if (*(int *)((long)local_530.p + lVar29 * 4 + lVar3) == 0) {
                          lVar20 = lVar19 + -1;
                          lVar34 = (lVar20 - lVar31) * 4 + lVar45 * 4;
                          iVar9 = *(int *)((long)local_530.p + lVar29 * 4 + lVar34);
                          lVar25 = lVar19 + 1;
                          lVar35 = lVar25 - lVar31;
                          if ((((iVar9 == 1) ||
                               (lVar17 = lVar35 * 4 + lVar45 * 4,
                               *(int *)((long)local_530.p + lVar29 * 4 + lVar17) == 1)) ||
                              (*(int *)((long)local_530.p + lVar16 * 4 + lVar10) == 1)) ||
                             (*(int *)((long)local_530.p + lVar46 * 4 + lVar3) == 1)) {
                            iVar8 = *(int *)((long)local_530.p +
                                            lVar35 * 4 + lVar29 * 4 + lVar45 * 4);
                            iVar22 = *(int *)((long)local_530.p + lVar16 * 4 + lVar10);
                            lVar16 = lVar19 - lVar39;
                            iVar18 = *(int *)((long)local_530.p + lVar46 * 4 + lVar3);
                            local_5f8.p[lVar38 + lVar16 + lVar33 + lVar15] =
                                 ((double)iVar18 * local_5f8.p[lVar38 + lVar16 + lVar40 + lVar15] +
                                 (double)iVar22 * local_5f8.p[lVar32 + lVar33 + lVar15 + lVar16] +
                                 (double)iVar9 *
                                 local_5f8.p[lVar38 + lVar33 + lVar15 + (lVar20 - lVar39)] +
                                 (double)iVar8 *
                                 local_5f8.p[lVar38 + lVar33 + lVar15 + (lVar25 - lVar39)]) /
                                 (double)(iVar8 + iVar22 + iVar9 + iVar18);
                          }
                          else {
                            iVar9 = *(int *)((long)local_530.p + (lVar20 - lVar31) * 4 + lVar10);
                            iVar8 = *(int *)((long)local_530.p + lVar35 * 4 + lVar10);
                            iVar22 = *(int *)((long)local_530.p + lVar46 * 4 + lVar34);
                            iVar18 = *(int *)((long)local_530.p + lVar46 * 4 + lVar17);
                            local_5f8.p[lVar38 + lVar33 + lVar15 + (lVar19 - lVar39)] =
                                 ((double)iVar18 *
                                  local_5f8.p[lVar38 + lVar40 + lVar15 + (lVar25 - lVar39)] +
                                  (double)iVar22 *
                                  local_5f8.p[lVar38 + lVar40 + lVar15 + (lVar20 - lVar39)] +
                                  (double)iVar9 *
                                  local_5f8.p[lVar32 + lVar33 + lVar15 + (lVar20 - lVar39)] +
                                  (double)iVar8 *
                                  local_5f8.p[lVar32 + lVar33 + lVar15 + (lVar25 - lVar39)] +
                                 local_5f8.p[lVar32 + lVar40 + lVar15 + (lVar19 - lVar39)]) /
                                 (double)(iVar9 + iVar8 + iVar22 + iVar18 + 1);
                          }
                        }
                        lVar19 = lVar19 + 1;
                      } while (uVar7 != (uint)lVar19);
                    }
                  }
                }
              }
              if (iVar4 <= iVar11) {
                lVar19 = (long)local_530.begin.y;
                local_5a8 = (double *)local_530.kstride;
                local_588 = (long)local_530.begin.z;
                lVar10 = local_4b0;
                do {
                  if (iVar5 <= iVar12) {
                    lVar39 = (lVar10 - local_588) * local_530.kstride;
                    lVar45 = (long)local_5f8.begin.y;
                    lVar29 = (long)local_5f8.begin.z;
                    lVar32 = (lVar10 - lVar29) * local_5f8.kstride;
                    lVar40 = local_5f8.nstride * local_658;
                    lVar31 = lVar39 * 4 + (local_4e8 - local_530.begin.x) * 4;
                    lVar46 = (long)(iVar23 - local_5f8.begin.x);
                    local_5b0 = (double *)(lVar10 + 1);
                    lVar38 = local_4a8;
                    do {
                      lVar15 = (lVar38 - lVar19) * local_530.jstride * 4 +
                               (local_4e8 - local_530.begin.x) * 4;
                      if (*(int *)((long)local_530.p + lVar39 * 4 + lVar15) == 0) {
                        lVar33 = (lVar38 - lVar45) * local_5f8.jstride;
                        iVar9 = *(int *)((long)local_530.p +
                                        ((lVar38 + -1) - lVar19) * local_530.jstride * 4 + lVar31);
                        iVar8 = *(int *)((long)local_530.p +
                                        ((lVar38 + 1) - lVar19) * local_530.jstride * 4 + lVar31);
                        iVar22 = *(int *)((long)local_530.p +
                                         ((lVar10 + -1) - local_588) * local_530.kstride * 4 +
                                         lVar15);
                        iVar18 = *(int *)((long)local_530.p +
                                         ((long)local_5b0 - local_588) * local_530.kstride * 4 +
                                         lVar15);
                        local_5f8.p[lVar33 + lVar46 + lVar32 + lVar40] =
                             ((double)iVar18 *
                              local_5f8.p
                              [lVar33 + lVar46 + ((long)local_5b0 - lVar29) * local_5f8.kstride +
                                                 lVar40] +
                             (double)iVar22 *
                             local_5f8.p
                             [lVar33 + lVar46 + ((lVar10 + -1) - lVar29) * local_5f8.kstride +
                                                lVar40] +
                             (double)iVar8 *
                             local_5f8.p
                             [lVar46 + lVar32 + lVar40 + ((lVar38 + 1) - lVar45) * local_5f8.jstride
                             ] + (double)iVar9 *
                                 local_5f8.p
                                 [lVar46 + lVar32 + lVar40 + ((lVar38 + -1) - lVar45) *
                                                             local_5f8.jstride] +
                                 local_5f8.p
                                 [lVar33 + (long)(local_5b4 - local_5f8.begin.x) + lVar32 + lVar40])
                             / (double)(iVar18 + iVar9 + iVar8 + iVar22 + 1);
                      }
                      lVar38 = lVar38 + 1;
                    } while (uVar44 != (uint)lVar38);
                  }
                  lVar10 = lVar10 + 1;
                } while (uVar43 != (uint)lVar10);
                if (iVar4 <= iVar11) {
                  lVar19 = (long)local_530.begin.y;
                  local_588 = (long)local_530.begin.z;
                  lVar10 = local_4b0;
                  do {
                    if (iVar5 <= iVar12) {
                      lVar39 = (lVar10 - local_588) * local_530.kstride;
                      lVar45 = (long)local_5f8.begin.y;
                      lVar32 = (long)local_5f8.begin.z;
                      lVar29 = (lVar10 - lVar32) * local_5f8.kstride;
                      lVar40 = local_5f8.nstride * local_658;
                      lVar31 = lVar39 * 4 + (local_5a0 - local_530.begin.x) * 4;
                      lVar46 = (long)(iVar42 - local_5f8.begin.x);
                      local_5b0 = (double *)(lVar10 + 1);
                      lVar38 = local_4a8;
                      do {
                        lVar15 = (lVar38 - lVar19) * local_530.jstride * 4 +
                                 (local_5a0 - local_530.begin.x) * 4;
                        if (*(int *)((long)local_530.p + lVar39 * 4 + lVar15) == 0) {
                          lVar33 = (lVar38 - lVar45) * local_5f8.jstride;
                          iVar9 = *(int *)((long)local_530.p +
                                          ((lVar38 + -1) - lVar19) * local_530.jstride * 4 + lVar31)
                          ;
                          iVar8 = *(int *)((long)local_530.p +
                                          ((lVar38 + 1) - lVar19) * local_530.jstride * 4 + lVar31);
                          iVar22 = *(int *)((long)local_530.p +
                                           ((lVar10 + -1) - local_588) * local_530.kstride * 4 +
                                           lVar15);
                          iVar18 = *(int *)((long)local_530.p +
                                           ((long)local_5b0 - local_588) * local_530.kstride * 4 +
                                           lVar15);
                          local_5f8.p[lVar33 + lVar46 + lVar29 + lVar40] =
                               ((double)iVar18 *
                                local_5f8.p
                                [lVar33 + lVar46 + ((long)local_5b0 - lVar32) * local_5f8.kstride +
                                                   lVar40] +
                               (double)iVar22 *
                               local_5f8.p
                               [lVar33 + lVar46 + ((lVar10 + -1) - lVar32) * local_5f8.kstride +
                                                  lVar40] +
                               (double)iVar8 *
                               local_5f8.p
                               [lVar46 + lVar29 + lVar40 + ((lVar38 + 1) - lVar45) *
                                                           local_5f8.jstride] +
                               (double)iVar9 *
                               local_5f8.p
                               [lVar46 + lVar29 + lVar40 + ((lVar38 + -1) - lVar45) *
                                                           local_5f8.jstride] +
                               local_5f8.p
                               [lVar33 + (long)(iVar13 - local_5f8.begin.x) + lVar29 + lVar40]) /
                               (double)(iVar18 + iVar9 + iVar8 + iVar22 + 1);
                        }
                        lVar38 = lVar38 + 1;
                      } while (uVar44 != (uint)lVar38);
                    }
                    lVar10 = lVar10 + 1;
                  } while (uVar43 != (uint)lVar10);
                  if (iVar4 <= iVar11) {
                    lVar19 = (long)local_530.begin.x;
                    lVar38 = (local_580 - local_530.begin.y) * local_530.jstride;
                    lVar31 = (long)local_530.begin.z;
                    lVar10 = local_4b0;
                    do {
                      if (local_5b4 <= iVar13) {
                        lVar33 = (lVar10 - lVar31) * local_530.kstride;
                        lVar45 = lVar33 * 4 + lVar38 * 4;
                        lVar39 = (long)local_5f8.begin.x;
                        lVar15 = (iVar21 - local_5f8.begin.y) * local_5f8.jstride;
                        lVar29 = (long)local_5f8.begin.z;
                        lVar40 = (lVar10 - lVar29) * local_5f8.kstride;
                        lVar32 = local_5f8.nstride * local_658;
                        lVar46 = local_4a0;
                        do {
                          lVar3 = (lVar46 - lVar19) * 4 + lVar38 * 4;
                          if (*(int *)((long)local_530.p + lVar33 * 4 + lVar3) == 0) {
                            iVar9 = *(int *)((long)local_530.p +
                                            ((lVar46 + -1) - lVar19) * 4 + lVar45);
                            iVar8 = *(int *)((long)local_530.p +
                                            ((lVar46 + 1) - lVar19) * 4 + lVar45);
                            lVar16 = lVar46 - lVar39;
                            iVar22 = *(int *)((long)local_530.p +
                                             ((lVar10 + -1) - lVar31) * local_530.kstride * 4 +
                                             lVar3);
                            iVar18 = *(int *)((long)local_530.p +
                                             ((lVar10 + 1) - lVar31) * local_530.kstride * 4 + lVar3
                                             );
                            local_5f8.p[lVar15 + lVar16 + lVar40 + lVar32] =
                                 ((double)iVar18 *
                                  local_5f8.p
                                  [lVar15 + lVar16 + ((lVar10 + 1) - lVar29) * local_5f8.kstride +
                                                     lVar32] +
                                 (double)iVar22 *
                                 local_5f8.p
                                 [lVar15 + lVar16 + ((lVar10 + -1) - lVar29) * local_5f8.kstride +
                                                    lVar32] +
                                 (double)iVar9 *
                                 local_5f8.p[lVar15 + lVar40 + lVar32 + ((lVar46 + -1) - lVar39)] +
                                 (double)iVar8 *
                                 local_5f8.p[lVar15 + lVar40 + lVar32 + ((lVar46 + 1) - lVar39)] +
                                 local_5f8.p
                                 [(iVar5 - local_5f8.begin.y) * local_5f8.jstride +
                                  lVar40 + lVar32 + lVar16]) /
                                 (double)(iVar18 + iVar9 + iVar8 + iVar22 + 1);
                          }
                          lVar46 = lVar46 + 1;
                        } while (uVar7 != (uint)lVar46);
                      }
                      lVar10 = lVar10 + 1;
                    } while (uVar43 != (uint)lVar10);
                    if (iVar4 <= iVar11) {
                      lVar19 = (long)local_530.begin.x;
                      lVar38 = (local_598 - local_530.begin.y) * local_530.jstride;
                      lVar31 = (long)local_530.begin.z;
                      lVar10 = local_4b0;
                      do {
                        if (local_5b4 <= iVar13) {
                          lVar33 = (lVar10 - lVar31) * local_530.kstride;
                          lVar45 = lVar33 * 4 + lVar38 * 4;
                          lVar39 = (long)local_5f8.begin.x;
                          lVar15 = (iVar37 - local_5f8.begin.y) * local_5f8.jstride;
                          lVar29 = (long)local_5f8.begin.z;
                          lVar40 = (lVar10 - lVar29) * local_5f8.kstride;
                          lVar32 = local_5f8.nstride * local_658;
                          lVar46 = local_4a0;
                          do {
                            lVar3 = (lVar46 - lVar19) * 4 + lVar38 * 4;
                            if (*(int *)((long)local_530.p + lVar33 * 4 + lVar3) == 0) {
                              iVar9 = *(int *)((long)local_530.p +
                                              ((lVar46 + -1) - lVar19) * 4 + lVar45);
                              iVar8 = *(int *)((long)local_530.p +
                                              ((lVar46 + 1) - lVar19) * 4 + lVar45);
                              lVar16 = lVar46 - lVar39;
                              iVar22 = *(int *)((long)local_530.p +
                                               ((lVar10 + -1) - lVar31) * local_530.kstride * 4 +
                                               lVar3);
                              iVar18 = *(int *)((long)local_530.p +
                                               ((lVar10 + 1) - lVar31) * local_530.kstride * 4 +
                                               lVar3);
                              local_5f8.p[lVar15 + lVar16 + lVar40 + lVar32] =
                                   ((double)iVar18 *
                                    local_5f8.p
                                    [lVar15 + lVar16 + ((lVar10 + 1) - lVar29) * local_5f8.kstride +
                                                       lVar32] +
                                   (double)iVar22 *
                                   local_5f8.p
                                   [lVar15 + lVar16 + ((lVar10 + -1) - lVar29) * local_5f8.kstride +
                                                      lVar32] +
                                   (double)iVar9 *
                                   local_5f8.p[lVar15 + lVar40 + lVar32 + ((lVar46 + -1) - lVar39)]
                                   + (double)iVar8 *
                                     local_5f8.p[lVar15 + lVar40 + lVar32 + ((lVar46 + 1) - lVar39)]
                                   + local_5f8.p
                                     [(iVar12 - local_5f8.begin.y) * local_5f8.jstride +
                                      lVar40 + lVar32 + lVar16]) /
                                   (double)(iVar18 + iVar9 + iVar8 + iVar22 + 1);
                            }
                            lVar46 = lVar46 + 1;
                          } while (uVar7 != (uint)lVar46);
                        }
                        lVar10 = lVar10 + 1;
                      } while (uVar43 != (uint)lVar10);
                    }
                  }
                }
              }
              if (iVar5 <= iVar12) {
                lVar19 = (long)local_530.begin.x;
                lVar31 = (long)local_530.begin.y;
                lVar38 = (local_578 - local_530.begin.z) * local_530.kstride;
                lVar10 = local_4a8;
                do {
                  if (local_5b4 <= iVar13) {
                    lVar45 = (lVar10 - lVar31) * local_530.jstride * 4 + lVar38 * 4;
                    lVar15 = (long)local_5f8.begin.x;
                    lVar29 = (long)local_5f8.begin.y;
                    lVar39 = (lVar10 - lVar29) * local_5f8.jstride;
                    lVar40 = (iVar28 - local_5f8.begin.z) * local_5f8.kstride;
                    lVar32 = local_5f8.nstride * local_658;
                    lVar46 = local_4a0;
                    do {
                      lVar33 = lVar46 - lVar19;
                      if (*(int *)((long)local_530.p + lVar33 * 4 + lVar45) == 0) {
                        iVar9 = *(int *)((long)local_530.p + ((lVar46 + -1) - lVar19) * 4 + lVar45);
                        iVar8 = *(int *)((long)local_530.p + ((lVar46 + 1) - lVar19) * 4 + lVar45);
                        iVar22 = *(int *)((long)local_530.p +
                                         lVar33 * 4 +
                                         ((lVar10 + -1) - lVar31) * local_530.jstride * 4 +
                                         lVar38 * 4);
                        lVar3 = lVar46 - lVar15;
                        iVar18 = *(int *)((long)local_530.p +
                                         lVar33 * 4 +
                                         ((lVar10 + 1) - lVar31) * local_530.jstride * 4 +
                                         lVar38 * 4);
                        local_5f8.p[lVar39 + lVar3 + lVar40 + lVar32] =
                             ((double)iVar18 *
                              local_5f8.p
                              [((lVar10 + 1) - lVar29) * local_5f8.jstride + lVar40 + lVar32 + lVar3
                              ] + (double)iVar22 *
                                  local_5f8.p
                                  [((lVar10 + -1) - lVar29) * local_5f8.jstride +
                                   lVar40 + lVar32 + lVar3] +
                                  (double)iVar9 *
                                  local_5f8.p[lVar39 + lVar40 + lVar32 + ((lVar46 + -1) - lVar15)] +
                                  (double)iVar8 *
                                  local_5f8.p[lVar39 + lVar40 + lVar32 + ((lVar46 + 1) - lVar15)] +
                             local_5f8.p
                             [lVar39 + lVar3 + (iVar4 - local_5f8.begin.z) * local_5f8.kstride +
                                               lVar32]) /
                             (double)(iVar18 + iVar9 + iVar8 + iVar22 + 1);
                      }
                      lVar46 = lVar46 + 1;
                    } while (uVar7 != (uint)lVar46);
                  }
                  lVar10 = lVar10 + 1;
                } while (uVar44 != (uint)lVar10);
                if (iVar5 <= iVar12) {
                  lVar19 = (long)local_530.begin.x;
                  lVar31 = (long)local_530.begin.y;
                  lVar38 = (local_590 - local_530.begin.z) * local_530.kstride;
                  lVar10 = local_4a8;
                  do {
                    if (local_5b4 <= iVar13) {
                      lVar45 = (lVar10 - lVar31) * local_530.jstride * 4 + lVar38 * 4;
                      lVar15 = (long)local_5f8.begin.x;
                      lVar29 = (long)local_5f8.begin.y;
                      lVar39 = (lVar10 - lVar29) * local_5f8.jstride;
                      lVar40 = (iVar36 - local_5f8.begin.z) * local_5f8.kstride;
                      lVar32 = local_5f8.nstride * local_658;
                      lVar46 = local_4a0;
                      do {
                        lVar33 = lVar46 - lVar19;
                        if (*(int *)((long)local_530.p + lVar33 * 4 + lVar45) == 0) {
                          iVar9 = *(int *)((long)local_530.p + ((lVar46 + -1) - lVar19) * 4 + lVar45
                                          );
                          iVar8 = *(int *)((long)local_530.p + ((lVar46 + 1) - lVar19) * 4 + lVar45)
                          ;
                          iVar22 = *(int *)((long)local_530.p +
                                           lVar33 * 4 +
                                           ((lVar10 + -1) - lVar31) * local_530.jstride * 4 +
                                           lVar38 * 4);
                          lVar3 = lVar46 - lVar15;
                          iVar18 = *(int *)((long)local_530.p +
                                           lVar33 * 4 +
                                           ((lVar10 + 1) - lVar31) * local_530.jstride * 4 +
                                           lVar38 * 4);
                          local_5f8.p[lVar39 + lVar3 + lVar40 + lVar32] =
                               ((double)iVar18 *
                                local_5f8.p
                                [((lVar10 + 1) - lVar29) * local_5f8.jstride +
                                 lVar40 + lVar32 + lVar3] +
                                (double)iVar22 *
                                local_5f8.p
                                [((lVar10 + -1) - lVar29) * local_5f8.jstride +
                                 lVar40 + lVar32 + lVar3] +
                                (double)iVar9 *
                                local_5f8.p[lVar39 + lVar40 + lVar32 + ((lVar46 + -1) - lVar15)] +
                                (double)iVar8 *
                                local_5f8.p[lVar39 + lVar40 + lVar32 + ((lVar46 + 1) - lVar15)] +
                               local_5f8.p
                               [lVar39 + lVar3 + (iVar11 - local_5f8.begin.z) * local_5f8.kstride +
                                                 lVar32]) /
                               (double)(iVar18 + iVar9 + iVar8 + iVar22 + 1);
                        }
                        lVar46 = lVar46 + 1;
                      } while (uVar7 != (uint)lVar46);
                    }
                    lVar10 = lVar10 + 1;
                  } while (uVar44 != (uint)lVar10);
                }
              }
              local_658 = local_658 + 1;
              local_498 = local_498 + 8;
            } while (local_658 != local_248);
          }
          MFIter::operator++((MFIter *)local_210);
        } while ((int)vStack_200.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage < local_1e8);
      }
      MFIter::~MFIter((MFIter *)local_210);
      uVar7 = (int)local_420 + 1;
      local_420 = (ulong)uVar7;
      local_410 = (ulong)((int)local_410 - 1);
      local_418 = (ulong)((int)local_418 - 1);
      local_440 = local_440 + 1;
    } while (uVar7 != local_444);
  }
  iMultiFab::~iMultiFab((iMultiFab *)&local_1b0);
  return;
}

Assistant:

void FirstOrderExtrap (MultiFab& mf, const Geometry& geom, int scomp, int ncomp, int ngrow)
    {
        BL_ASSERT(mf.nGrow() >= ngrow);
        BL_ASSERT(scomp >= 0);
        BL_ASSERT((scomp+ncomp) <= mf.nComp());

        iMultiFab mask(mf.boxArray(), mf.DistributionMap(), 1, ngrow, MFInfo(),
                       DefaultFabFactory<IArrayBox>());
        mask.BuildMask(geom.Domain(), geom.periodicity(),
                       finebnd, crsebnd, physbnd, interior);

        // Do the extrap. on successive layers of ghost cells
        for (int layer = 0; layer < ngrow; layer++) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(mf); mfi.isValid(); ++mfi)
            {
                const Box& bx        = mfi.validbox();
                const Box& gbx       = amrex::grow(bx,layer);
                auto const& mask_arr = mask.const_array(mfi);
                auto const& data_arr = mf.array(mfi,scomp);

                if (Gpu::inLaunchRegion()) {
                    // set the crse cell to zero in the current layer
                    ParallelFor(amrex::grow(gbx,1), ncomp,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                    {
                       if (!gbx.contains(i,j,k)) {
                           if (mask_arr(i,j,k) == crsebnd) data_arr(i,j,k,n) = 0.0;
                       }
                    });
                    ParallelFor(amrex::grow(gbx,1), ncomp,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                    {
                       amrex_first_order_extrap_gpu(i, j, k, n, bx, mask_arr, data_arr);
                    });
                } else {
                    amrex_first_order_extrap_cpu(gbx, ncomp, mask_arr, data_arr);
                }
            }
        }
    }